

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop_x86_avx512.cpp
# Opt level: O0

int ncnn::unary_op_inplace<ncnn::UnaryOp_x86_avx512_functor::unary_op_asin>(Mat *a,Option *opt)

{
  bool bVar1;
  byte bVar2;
  undefined1 auVar3 [16];
  undefined8 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined8 uVar11;
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  long *in_RDI;
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  float fVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  __m128 _p_2;
  __m256 _p_1;
  __m512 _p;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  unary_op_asin op;
  Mat *m;
  __m512 final_approx;
  __m512 output_approx;
  __m512 fourth_power_of_input_approx;
  __m512 square_of_input_approx;
  __m512 input_approx;
  __m512 big_input_approx;
  __m512 is_big_input;
  __mmask16 is_small_input;
  __m512 absolute;
  __m512 negative_mask;
  __m512 magic_three;
  __m512 magic_half_pi;
  __m512 magic_a1;
  __m512 magic_a0;
  __m512 magic_a3;
  __m512 magic_a2;
  __m512 magic_a5;
  __m512 magic_a4;
  __m512 magic_one;
  __m512 magic_half_one;
  __m512 magic_negative_zero;
  __m256 final_approx_1;
  __m256 output_approx_1;
  __m256 fourth_power_of_input_approx_1;
  __m256 square_of_input_approx_1;
  __m256 input_approx_1;
  __m256 big_input_approx_1;
  __m256 is_big_input_1;
  __m256 is_small_input_1;
  __m256 absolute_1;
  __m256 negative_mask_1;
  __m256 magic_three_1;
  __m256 magic_half_pi_1;
  __m256 magic_a1_1;
  __m256 magic_a0_1;
  __m256 magic_a3_1;
  __m256 magic_a2_1;
  __m256 magic_a5_1;
  __m256 magic_a4_1;
  __m256 magic_one_1;
  __m256 magic_half_one_1;
  __m256 magic_negative_zero_1;
  __m128 final_approx_2;
  __m128 output_approx_2;
  __m128 fourth_power_of_input_approx_2;
  __m128 square_of_input_approx_2;
  __m128 input_approx_2;
  __m128 big_input_approx_2;
  __m128 is_big_input_2;
  __m128 is_small_input_2;
  __m128 absolute_2;
  __m128 negative_mask_2;
  __m128 magic_three_2;
  __m128 magic_half_pi_2;
  __m128 magic_a1_2;
  __m128 magic_a0_2;
  __m128 magic_a3_2;
  __m128 magic_a2_2;
  __m128 magic_a5_2;
  __m128 magic_a4_2;
  __m128 magic_one_2;
  __m128 magic_half_one_2;
  __m128 magic_negative_zero_2;
  undefined1 local_2df0 [16];
  undefined1 local_2de0 [32];
  undefined1 local_2dc0 [64];
  int local_2d7c;
  undefined8 local_2d78;
  undefined8 local_2d70;
  undefined8 local_2d68;
  undefined4 local_2d60;
  long local_2d58;
  undefined4 local_2d50;
  undefined4 local_2d4c;
  undefined4 local_2d48;
  undefined4 local_2d44;
  undefined4 local_2d40;
  undefined8 local_2d38;
  undefined1 (*local_2d30) [64];
  int local_2d28;
  int local_2d24;
  int local_2d20;
  int local_2d1c;
  int local_2d18;
  int local_2d14;
  int local_2d10;
  undefined1 local_2d09 [9];
  long *local_2d00;
  undefined1 local_2cf5;
  int local_2cf4;
  undefined8 *local_2ce8;
  undefined8 *local_2ce0;
  undefined8 *local_2cd0;
  undefined1 (*local_2cc8) [64];
  undefined8 local_2cc0;
  undefined8 uStack_2cb8;
  undefined8 uStack_2cb0;
  undefined8 uStack_2ca8;
  undefined8 uStack_2ca0;
  undefined8 uStack_2c98;
  undefined8 uStack_2c90;
  undefined8 uStack_2c88;
  undefined1 (*local_2c50) [64];
  undefined1 (*local_2c48) [64];
  undefined8 local_2c40;
  undefined8 uStack_2c38;
  undefined8 uStack_2c30;
  undefined8 uStack_2c28;
  undefined1 (*local_2c20) [64];
  undefined1 (*local_2c18) [64];
  undefined8 local_2c10;
  undefined8 uStack_2c08;
  undefined1 (*local_2c00) [64];
  long local_2bf8;
  undefined4 local_2bec;
  long local_2be8;
  undefined1 (*local_2be0) [64];
  undefined4 local_2bd4;
  int local_2bd0;
  int local_2bcc;
  undefined8 *local_2bc8;
  undefined4 local_2bbc;
  long local_2bb8;
  undefined8 *local_2ba8;
  undefined1 *local_2b80;
  undefined1 *local_2b78;
  undefined1 *local_2b70;
  undefined1 *local_2b68;
  undefined1 *local_2b60;
  undefined1 *local_2b58;
  undefined1 (*local_2b50) [64];
  undefined1 *local_2b48;
  undefined1 local_2b40 [64];
  undefined1 local_2b00 [64];
  undefined1 local_2ac0 [64];
  undefined1 local_2a80 [64];
  uint local_2a40;
  uint uStack_2a3c;
  uint uStack_2a38;
  uint uStack_2a34;
  uint uStack_2a30;
  uint uStack_2a2c;
  uint uStack_2a28;
  uint uStack_2a24;
  uint uStack_2a20;
  uint uStack_2a1c;
  uint uStack_2a18;
  uint uStack_2a14;
  uint uStack_2a10;
  uint uStack_2a0c;
  uint uStack_2a08;
  uint uStack_2a04;
  undefined1 local_2a00 [64];
  int local_29c0;
  int iStack_29bc;
  int iStack_29b8;
  int iStack_29b4;
  int iStack_29b0;
  int iStack_29ac;
  int iStack_29a8;
  int iStack_29a4;
  int iStack_29a0;
  int iStack_299c;
  int iStack_2998;
  int iStack_2994;
  int iStack_2990;
  int iStack_298c;
  int iStack_2988;
  int iStack_2984;
  ushort local_2942;
  undefined1 local_2940 [64];
  undefined1 local_2900 [64];
  undefined8 local_28c0;
  undefined8 uStack_28b8;
  undefined8 uStack_28b0;
  undefined8 uStack_28a8;
  undefined8 uStack_28a0;
  undefined8 uStack_2898;
  undefined8 uStack_2890;
  undefined8 uStack_2888;
  undefined8 local_2880;
  undefined8 uStack_2878;
  undefined8 uStack_2870;
  undefined8 uStack_2868;
  undefined8 uStack_2860;
  undefined8 uStack_2858;
  undefined8 uStack_2850;
  undefined8 uStack_2848;
  undefined8 local_2840;
  undefined8 uStack_2838;
  undefined8 uStack_2830;
  undefined8 uStack_2828;
  undefined8 uStack_2820;
  undefined8 uStack_2818;
  undefined8 uStack_2810;
  undefined8 uStack_2808;
  undefined8 local_2800;
  undefined8 uStack_27f8;
  undefined8 uStack_27f0;
  undefined8 uStack_27e8;
  undefined8 uStack_27e0;
  undefined8 uStack_27d8;
  undefined8 uStack_27d0;
  undefined8 uStack_27c8;
  undefined8 local_27c0;
  undefined8 uStack_27b8;
  undefined8 uStack_27b0;
  undefined8 uStack_27a8;
  undefined8 uStack_27a0;
  undefined8 uStack_2798;
  undefined8 uStack_2790;
  undefined8 uStack_2788;
  undefined8 local_2780;
  undefined8 uStack_2778;
  undefined8 uStack_2770;
  undefined8 uStack_2768;
  undefined8 uStack_2760;
  undefined8 uStack_2758;
  undefined8 uStack_2750;
  undefined8 uStack_2748;
  undefined8 local_2740;
  undefined8 uStack_2738;
  undefined8 uStack_2730;
  undefined8 uStack_2728;
  undefined8 uStack_2720;
  undefined8 uStack_2718;
  undefined8 uStack_2710;
  undefined8 uStack_2708;
  undefined8 local_2700;
  undefined8 uStack_26f8;
  undefined8 uStack_26f0;
  undefined8 uStack_26e8;
  undefined8 uStack_26e0;
  undefined8 uStack_26d8;
  undefined8 uStack_26d0;
  undefined8 uStack_26c8;
  undefined8 local_26c0;
  undefined8 uStack_26b8;
  undefined8 uStack_26b0;
  undefined8 uStack_26a8;
  undefined8 uStack_26a0;
  undefined8 uStack_2698;
  undefined8 uStack_2690;
  undefined8 uStack_2688;
  undefined8 local_2680;
  undefined8 uStack_2678;
  undefined8 uStack_2670;
  undefined8 uStack_2668;
  undefined8 uStack_2660;
  undefined8 uStack_2658;
  undefined8 uStack_2650;
  undefined8 uStack_2648;
  undefined8 local_2640;
  undefined8 uStack_2638;
  undefined8 uStack_2630;
  undefined8 uStack_2628;
  undefined8 uStack_2620;
  undefined8 uStack_2618;
  undefined8 uStack_2610;
  undefined8 uStack_2608;
  undefined8 local_2600;
  undefined8 uStack_25f8;
  undefined8 uStack_25f0;
  undefined8 uStack_25e8;
  undefined8 uStack_25e0;
  undefined8 uStack_25d8;
  undefined8 uStack_25d0;
  undefined8 uStack_25c8;
  undefined8 local_25c0;
  undefined8 uStack_25b8;
  undefined8 uStack_25b0;
  undefined8 uStack_25a8;
  undefined8 uStack_25a0;
  undefined8 uStack_2598;
  undefined8 uStack_2590;
  undefined8 uStack_2588;
  undefined8 local_2580;
  undefined8 uStack_2578;
  undefined8 uStack_2570;
  undefined8 uStack_2568;
  undefined8 uStack_2560;
  undefined8 uStack_2558;
  undefined8 uStack_2550;
  undefined8 uStack_2548;
  undefined8 local_2540;
  undefined8 uStack_2538;
  undefined8 uStack_2530;
  undefined8 uStack_2528;
  undefined8 uStack_2520;
  undefined8 uStack_2518;
  undefined8 uStack_2510;
  undefined8 uStack_2508;
  undefined8 local_2500;
  undefined8 uStack_24f8;
  undefined8 uStack_24f0;
  undefined8 uStack_24e8;
  undefined8 uStack_24e0;
  undefined8 uStack_24d8;
  undefined8 uStack_24d0;
  undefined8 uStack_24c8;
  undefined8 local_24c0;
  undefined8 uStack_24b8;
  undefined8 uStack_24b0;
  undefined8 uStack_24a8;
  undefined8 uStack_24a0;
  undefined8 uStack_2498;
  undefined8 uStack_2490;
  undefined8 uStack_2488;
  undefined8 local_2480;
  undefined8 uStack_2478;
  undefined8 uStack_2470;
  undefined8 uStack_2468;
  undefined8 uStack_2460;
  undefined8 uStack_2458;
  undefined8 uStack_2450;
  undefined8 uStack_2448;
  undefined8 local_2440;
  undefined8 uStack_2438;
  undefined8 uStack_2430;
  undefined8 uStack_2428;
  undefined8 uStack_2420;
  undefined8 uStack_2418;
  undefined8 uStack_2410;
  undefined8 uStack_2408;
  undefined8 local_2400;
  undefined8 uStack_23f8;
  undefined8 uStack_23f0;
  undefined8 uStack_23e8;
  undefined8 uStack_23e0;
  undefined8 uStack_23d8;
  undefined8 uStack_23d0;
  undefined8 uStack_23c8;
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  undefined8 uStack_23a0;
  undefined8 uStack_2398;
  undefined8 uStack_2390;
  undefined8 uStack_2388;
  undefined8 local_2380;
  undefined8 uStack_2378;
  undefined8 uStack_2370;
  undefined8 uStack_2368;
  undefined8 uStack_2360;
  undefined8 uStack_2358;
  undefined8 uStack_2350;
  undefined8 uStack_2348;
  undefined8 local_2340;
  undefined8 uStack_2338;
  undefined8 uStack_2330;
  undefined8 uStack_2328;
  undefined8 uStack_2320;
  undefined8 uStack_2318;
  undefined8 uStack_2310;
  undefined8 uStack_2308;
  undefined8 local_2300;
  undefined8 uStack_22f8;
  undefined8 uStack_22f0;
  undefined8 uStack_22e8;
  undefined8 uStack_22e0;
  undefined8 uStack_22d8;
  undefined8 uStack_22d0;
  undefined8 uStack_22c8;
  undefined1 local_22c0 [64];
  undefined8 local_2280;
  undefined8 uStack_2278;
  undefined8 uStack_2270;
  undefined8 uStack_2268;
  undefined8 uStack_2260;
  undefined8 uStack_2258;
  undefined8 uStack_2250;
  undefined8 uStack_2248;
  undefined1 local_2240 [64];
  undefined1 local_2200 [64];
  undefined1 local_21c0 [64];
  undefined1 local_2180 [64];
  undefined1 local_2140 [64];
  undefined1 local_2100 [64];
  undefined8 local_20c0;
  undefined8 uStack_20b8;
  undefined8 uStack_20b0;
  undefined8 uStack_20a8;
  undefined8 uStack_20a0;
  undefined8 uStack_2098;
  undefined8 uStack_2090;
  undefined8 uStack_2088;
  undefined8 local_2080;
  undefined8 uStack_2078;
  undefined8 uStack_2070;
  undefined8 uStack_2068;
  undefined8 uStack_2060;
  undefined8 uStack_2058;
  undefined8 uStack_2050;
  undefined8 uStack_2048;
  undefined1 local_2040 [64];
  undefined8 local_2000;
  undefined8 uStack_1ff8;
  undefined8 uStack_1ff0;
  undefined8 uStack_1fe8;
  undefined8 uStack_1fe0;
  undefined8 uStack_1fd8;
  undefined8 uStack_1fd0;
  undefined8 uStack_1fc8;
  undefined8 local_1fc0;
  undefined8 uStack_1fb8;
  undefined8 uStack_1fb0;
  undefined8 uStack_1fa8;
  undefined8 uStack_1fa0;
  undefined8 uStack_1f98;
  undefined8 uStack_1f90;
  undefined8 uStack_1f88;
  undefined8 local_1f80;
  undefined8 uStack_1f78;
  undefined8 uStack_1f70;
  undefined8 uStack_1f68;
  undefined8 uStack_1f60;
  undefined8 uStack_1f58;
  undefined8 uStack_1f50;
  undefined8 uStack_1f48;
  undefined8 local_1f40;
  undefined8 uStack_1f38;
  undefined8 uStack_1f30;
  undefined8 uStack_1f28;
  undefined8 uStack_1f20;
  undefined8 uStack_1f18;
  undefined8 uStack_1f10;
  undefined8 uStack_1f08;
  undefined8 local_1f00;
  undefined8 uStack_1ef8;
  undefined8 uStack_1ef0;
  undefined8 uStack_1ee8;
  undefined8 uStack_1ee0;
  undefined8 uStack_1ed8;
  undefined8 uStack_1ed0;
  undefined8 uStack_1ec8;
  undefined1 local_1ec0 [64];
  undefined8 local_1e80;
  undefined8 uStack_1e78;
  undefined8 uStack_1e70;
  undefined8 uStack_1e68;
  undefined8 uStack_1e60;
  undefined8 uStack_1e58;
  undefined8 uStack_1e50;
  undefined8 uStack_1e48;
  undefined8 local_1e40;
  undefined8 uStack_1e38;
  undefined8 uStack_1e30;
  undefined8 uStack_1e28;
  undefined8 uStack_1e20;
  undefined8 uStack_1e18;
  undefined8 uStack_1e10;
  undefined8 uStack_1e08;
  undefined8 local_1e00;
  undefined8 uStack_1df8;
  undefined8 uStack_1df0;
  undefined8 uStack_1de8;
  undefined8 uStack_1de0;
  undefined8 uStack_1dd8;
  undefined8 uStack_1dd0;
  undefined8 uStack_1dc8;
  undefined8 local_1dc0;
  undefined8 uStack_1db8;
  undefined8 uStack_1db0;
  undefined8 uStack_1da8;
  undefined8 uStack_1da0;
  undefined8 uStack_1d98;
  undefined8 uStack_1d90;
  undefined8 uStack_1d88;
  undefined8 local_1d80;
  undefined8 uStack_1d78;
  undefined8 uStack_1d70;
  undefined8 uStack_1d68;
  undefined8 uStack_1d60;
  undefined8 uStack_1d58;
  undefined8 uStack_1d50;
  undefined8 uStack_1d48;
  undefined8 local_1d40;
  undefined8 uStack_1d38;
  undefined8 uStack_1d30;
  undefined8 uStack_1d28;
  undefined8 uStack_1d20;
  undefined8 uStack_1d18;
  undefined8 uStack_1d10;
  undefined8 uStack_1d08;
  undefined8 local_1d00;
  undefined8 uStack_1cf8;
  undefined8 uStack_1cf0;
  undefined8 uStack_1ce8;
  undefined8 uStack_1ce0;
  undefined8 uStack_1cd8;
  undefined8 uStack_1cd0;
  undefined8 uStack_1cc8;
  undefined8 local_1cc0;
  undefined8 uStack_1cb8;
  undefined8 uStack_1cb0;
  undefined8 uStack_1ca8;
  undefined8 uStack_1ca0;
  undefined8 uStack_1c98;
  undefined8 uStack_1c90;
  undefined8 uStack_1c88;
  undefined8 local_1c80;
  undefined8 uStack_1c78;
  undefined8 uStack_1c70;
  undefined8 uStack_1c68;
  undefined8 uStack_1c60;
  undefined8 uStack_1c58;
  undefined8 uStack_1c50;
  undefined8 uStack_1c48;
  undefined8 local_1c40;
  undefined8 uStack_1c38;
  undefined8 uStack_1c30;
  undefined8 uStack_1c28;
  undefined8 uStack_1c20;
  undefined8 uStack_1c18;
  undefined8 uStack_1c10;
  undefined8 uStack_1c08;
  undefined8 local_1c00;
  undefined8 uStack_1bf8;
  undefined8 uStack_1bf0;
  undefined8 uStack_1be8;
  undefined8 uStack_1be0;
  undefined8 uStack_1bd8;
  undefined8 uStack_1bd0;
  undefined8 uStack_1bc8;
  undefined1 local_1bc0 [64];
  undefined4 local_1b44;
  undefined1 local_1b40 [64];
  undefined4 local_1ac4;
  undefined1 local_1ac0 [64];
  undefined4 local_1a44;
  undefined1 local_1a40 [64];
  undefined4 local_19c4;
  undefined1 local_19c0 [64];
  undefined4 local_1944;
  undefined1 local_1940 [64];
  undefined4 local_18c4;
  undefined1 local_18c0 [64];
  undefined4 local_1844;
  undefined1 local_1840 [64];
  undefined4 local_17c4;
  undefined1 local_17c0 [64];
  undefined4 local_1744;
  undefined1 local_1740 [64];
  undefined4 local_16c4;
  undefined1 local_16c0 [64];
  undefined4 local_1644;
  undefined8 local_1640;
  undefined8 uStack_1638;
  undefined8 uStack_1630;
  undefined8 uStack_1628;
  undefined8 uStack_1620;
  undefined8 uStack_1618;
  undefined8 uStack_1610;
  undefined8 uStack_1608;
  ushort local_15c2;
  undefined8 local_15c0;
  undefined8 uStack_15b8;
  undefined8 uStack_15b0;
  undefined8 uStack_15a8;
  undefined8 uStack_15a0;
  undefined8 uStack_1598;
  undefined8 uStack_1590;
  undefined8 uStack_1588;
  undefined8 local_1580;
  undefined8 uStack_1578;
  undefined8 uStack_1570;
  undefined8 uStack_1568;
  undefined8 uStack_1560;
  undefined8 uStack_1558;
  undefined8 uStack_1550;
  undefined8 uStack_1548;
  ushort local_1502;
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  undefined8 uStack_14e0;
  undefined8 uStack_14d8;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  float local_14c0;
  float fStack_14bc;
  float fStack_14b8;
  float fStack_14b4;
  float fStack_14b0;
  float fStack_14ac;
  float fStack_14a8;
  undefined4 uStack_14a4;
  undefined1 local_14a0 [32];
  float local_1480;
  float fStack_147c;
  float fStack_1478;
  float fStack_1474;
  float fStack_1470;
  float fStack_146c;
  float fStack_1468;
  undefined4 uStack_1464;
  undefined1 local_1460 [32];
  undefined1 local_1440 [32];
  undefined1 local_1420 [32];
  undefined1 local_1400 [32];
  undefined1 local_13e0 [32];
  undefined1 local_13c0 [32];
  float local_13a0;
  float fStack_139c;
  float fStack_1398;
  float fStack_1394;
  float fStack_1390;
  float fStack_138c;
  float fStack_1388;
  undefined4 uStack_1384;
  float local_1380;
  float fStack_137c;
  float fStack_1378;
  float fStack_1374;
  float fStack_1370;
  float fStack_136c;
  float fStack_1368;
  undefined4 uStack_1364;
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  undefined1 local_1300 [32];
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined1 local_f60 [8];
  float fStack_f58;
  float fStack_f54;
  float fStack_f50;
  float fStack_f4c;
  float fStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  float local_f20;
  float fStack_f1c;
  float fStack_f18;
  float fStack_f14;
  float fStack_f10;
  float fStack_f0c;
  float fStack_f08;
  undefined4 uStack_f04;
  float *local_ee8;
  undefined1 *local_ee0;
  float *local_ed8;
  undefined1 *local_ed0;
  undefined1 *local_ec8;
  float *local_ec0;
  undefined8 *local_eb8;
  undefined1 *local_eb0;
  float *local_ea8;
  undefined8 *local_ea0;
  undefined8 *local_e98;
  float *local_e90;
  undefined8 *local_e88;
  undefined1 *local_e80;
  float *local_e78;
  undefined8 *local_e70;
  undefined8 *local_e68;
  float *local_e60;
  undefined8 *local_e58;
  undefined1 *local_e50;
  undefined8 *local_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  ulong uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined1 local_b60 [32];
  undefined1 local_b40 [32];
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  undefined4 local_a4c;
  undefined4 local_a48;
  undefined4 local_a44;
  undefined4 local_a40;
  undefined4 local_a3c;
  undefined4 local_a38;
  undefined4 local_a34;
  undefined4 local_a30;
  undefined4 local_a2c;
  undefined4 local_a28;
  undefined4 local_a24;
  undefined1 local_a20 [16];
  undefined1 auStack_a10 [16];
  undefined4 local_a00;
  undefined4 local_9fc;
  undefined4 local_9f8;
  undefined4 local_9f4;
  undefined4 local_9f0;
  undefined4 local_9ec;
  undefined4 local_9e8;
  undefined4 local_9e4;
  undefined1 local_9e0 [16];
  undefined1 auStack_9d0 [16];
  undefined4 local_9c0;
  undefined4 local_9bc;
  undefined4 local_9b8;
  undefined4 local_9b4;
  undefined4 local_9b0;
  undefined4 local_9ac;
  undefined4 local_9a8;
  undefined4 local_9a4;
  undefined1 local_9a0 [16];
  undefined1 auStack_990 [16];
  undefined4 local_980;
  undefined4 local_97c;
  undefined4 local_978;
  undefined4 local_974;
  undefined4 local_970;
  undefined4 local_96c;
  undefined4 local_968;
  undefined4 local_964;
  undefined1 local_960 [16];
  undefined1 auStack_950 [16];
  undefined4 local_940;
  undefined4 local_93c;
  undefined4 local_938;
  undefined4 local_934;
  undefined4 local_930;
  undefined4 local_92c;
  undefined4 local_928;
  undefined4 local_924;
  undefined1 local_920 [16];
  undefined1 auStack_910 [16];
  undefined4 local_900;
  undefined4 local_8fc;
  undefined4 local_8f8;
  undefined4 local_8f4;
  undefined4 local_8f0;
  undefined4 local_8ec;
  undefined4 local_8e8;
  undefined4 local_8e4;
  undefined1 local_8e0 [16];
  undefined1 auStack_8d0 [16];
  undefined4 local_8c0;
  undefined4 local_8bc;
  undefined4 local_8b8;
  undefined4 local_8b4;
  undefined4 local_8b0;
  undefined4 local_8ac;
  undefined4 local_8a8;
  undefined4 local_8a4;
  undefined1 local_8a0 [16];
  undefined1 auStack_890 [16];
  undefined4 local_880;
  undefined4 local_87c;
  undefined4 local_878;
  undefined4 local_874;
  undefined4 local_870;
  undefined4 local_86c;
  undefined4 local_868;
  undefined4 local_864;
  undefined1 local_860 [16];
  undefined1 auStack_850 [16];
  undefined4 local_840;
  undefined4 local_83c;
  undefined4 local_838;
  undefined4 local_834;
  undefined4 local_830;
  undefined4 local_82c;
  undefined4 local_828;
  undefined4 local_824;
  undefined1 local_820 [16];
  undefined1 auStack_810 [16];
  undefined4 local_800;
  undefined4 local_7fc;
  undefined4 local_7f8;
  undefined4 local_7f4;
  undefined4 local_7f0;
  undefined4 local_7ec;
  undefined4 local_7e8;
  undefined4 local_7e4;
  undefined1 local_7e0 [16];
  undefined1 auStack_7d0 [16];
  undefined4 local_7c0;
  undefined4 local_7bc;
  undefined4 local_7b8;
  undefined4 local_7b4;
  undefined4 local_7b0;
  undefined4 local_7ac;
  undefined4 local_7a8;
  undefined4 local_7a4;
  undefined1 local_7a0 [16];
  undefined1 auStack_790 [16];
  undefined4 local_780;
  undefined4 local_77c;
  undefined4 local_778;
  undefined4 local_774;
  undefined4 local_770;
  undefined4 local_76c;
  undefined4 local_768;
  undefined4 local_764;
  float local_760;
  float fStack_75c;
  float fStack_758;
  float fStack_754;
  undefined1 local_750 [16];
  float local_740;
  float fStack_73c;
  float fStack_738;
  float fStack_734;
  undefined1 local_730 [16];
  undefined1 local_720 [16];
  undefined1 local_710 [16];
  undefined1 local_700 [16];
  undefined1 local_6f0 [16];
  undefined1 local_6e0 [16];
  float local_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  float local_6c0;
  float fStack_6bc;
  float fStack_6b8;
  float fStack_6b4;
  undefined1 local_6b0 [16];
  undefined1 local_6a0 [16];
  undefined1 local_690 [16];
  undefined1 local_680 [16];
  undefined1 local_670 [16];
  undefined1 local_660 [16];
  undefined8 local_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 local_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 local_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 local_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 local_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 local_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 local_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 local_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 local_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 local_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 local_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 local_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined1 local_4b0 [8];
  float fStack_4a8;
  float fStack_4a4;
  undefined8 local_4a0;
  undefined8 uStack_498;
  float local_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined8 *local_478;
  undefined1 *local_470;
  undefined8 *local_468;
  float *local_460;
  undefined1 *local_458;
  float *local_450;
  undefined1 *local_448;
  undefined1 *local_440;
  float *local_438;
  undefined8 *local_430;
  undefined1 *local_428;
  float *local_420;
  undefined8 *local_418;
  undefined8 *local_410;
  float *local_408;
  undefined8 *local_400;
  undefined1 *local_3f8;
  float *local_3f0;
  undefined8 *local_3e8;
  undefined8 *local_3e0;
  float *local_3d8;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined1 local_240 [16];
  undefined1 local_230 [16];
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined4 local_1b4;
  undefined4 local_1b0;
  undefined4 uStack_1ac;
  undefined4 uStack_1a8;
  undefined4 uStack_1a4;
  undefined4 local_198;
  undefined4 local_194;
  undefined4 local_190;
  undefined4 uStack_18c;
  undefined4 uStack_188;
  undefined4 uStack_184;
  undefined4 local_178;
  undefined4 local_174;
  undefined4 local_170;
  undefined4 uStack_16c;
  undefined4 uStack_168;
  undefined4 uStack_164;
  undefined4 local_158;
  undefined4 local_154;
  undefined4 local_150;
  undefined4 uStack_14c;
  undefined4 uStack_148;
  undefined4 uStack_144;
  undefined4 local_138;
  undefined4 local_134;
  undefined4 local_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  undefined4 local_118;
  undefined4 local_114;
  undefined4 local_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined4 local_f8;
  undefined4 local_f4;
  undefined4 local_f0;
  undefined4 uStack_ec;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  undefined4 local_d8;
  undefined4 local_d4;
  undefined4 local_d0;
  undefined4 uStack_cc;
  undefined4 uStack_c8;
  undefined4 uStack_c4;
  undefined4 local_b8;
  undefined4 local_b4;
  undefined4 local_b0;
  undefined4 uStack_ac;
  undefined4 uStack_a8;
  undefined4 uStack_a4;
  undefined4 local_98;
  undefined4 local_94;
  undefined4 local_90;
  undefined4 uStack_8c;
  undefined4 uStack_88;
  undefined4 uStack_84;
  undefined4 local_78;
  undefined4 local_74;
  undefined4 local_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined4 uStack_64;
  undefined4 local_54;
  
  local_2d10 = *(int *)((long)in_RDI + 0x2c);
  local_2d14 = (int)in_RDI[6];
  local_2d18 = *(int *)((long)in_RDI + 0x34);
  local_2d1c = (int)in_RDI[7];
  local_2d20 = (int)in_RDI[3];
  local_2d24 = local_2d10 * local_2d14 * local_2d18 * local_2d20;
  local_2d00 = in_RDI;
  for (local_2d28 = 0; local_2d28 < local_2d1c; local_2d28 = local_2d28 + 1) {
    local_2ce8 = &local_2d78;
    local_2bcc = *(int *)((long)local_2d00 + 0x2c);
    local_2bd0 = (int)local_2d00[6];
    local_2bd4 = *(undefined4 *)((long)local_2d00 + 0x34);
    local_2be0 = (undefined1 (*) [64])
                 (*local_2d00 + local_2d00[8] * (long)local_2d28 * local_2d00[2]);
    local_2be8 = local_2d00[2];
    local_2bec = (undefined4)local_2d00[3];
    local_2bf8 = local_2d00[4];
    local_2bc8 = &local_2d78;
    local_2bb8 = (long)local_2bcc * (long)local_2bd0 * local_2be8;
    local_2ce0 = &local_2d78;
    local_2cd0 = &local_2d78;
    local_2bbc = 0x10;
    local_2cf4 = local_2d28;
    local_2cf5 = 1;
    local_2d78 = 0;
    local_2d68 = 0;
    local_2d60 = 0;
    local_2d50 = 0;
    local_2d4c = 0;
    local_2d48 = 0;
    local_2d44 = 0;
    local_2d40 = 0;
    local_2d38 = 0;
    local_2d70 = 0;
    local_2d30 = local_2be0;
    for (local_2d7c = 0; local_2d7c + 0xf < local_2d24; local_2d7c = local_2d7c + 0x10) {
      local_2cc8 = local_2d30;
      auVar51 = *local_2d30;
      local_2b78 = local_2d09;
      local_2b80 = local_2dc0;
      local_2dc0._0_8_ = auVar51._0_8_;
      local_2600 = local_2dc0._0_8_;
      local_2dc0._8_8_ = auVar51._8_8_;
      uStack_25f8 = local_2dc0._8_8_;
      local_2dc0._16_8_ = auVar51._16_8_;
      uStack_25f0 = local_2dc0._16_8_;
      local_2dc0._24_8_ = auVar51._24_8_;
      uStack_25e8 = local_2dc0._24_8_;
      local_2dc0._32_8_ = auVar51._32_8_;
      uStack_25e0 = local_2dc0._32_8_;
      local_2dc0._40_8_ = auVar51._40_8_;
      uStack_25d8 = local_2dc0._40_8_;
      local_2dc0._48_8_ = auVar51._48_8_;
      uStack_25d0 = local_2dc0._48_8_;
      local_2dc0._56_8_ = auVar51._56_8_;
      uStack_25c8 = local_2dc0._56_8_;
      local_1644 = 0x80000000;
      local_16c0 = vbroadcastss_avx512f(ZEXT416(0x80000000));
      local_2640 = local_16c0._0_8_;
      uStack_2638 = local_16c0._8_8_;
      uStack_2630 = local_16c0._16_8_;
      uStack_2628 = local_16c0._24_8_;
      uStack_2620 = local_16c0._32_8_;
      uStack_2618 = local_16c0._40_8_;
      uStack_2610 = local_16c0._48_8_;
      uStack_2608 = local_16c0._56_8_;
      local_16c4 = 0x3f000000;
      local_1740 = vbroadcastss_avx512f(ZEXT416(0x3f000000));
      local_2680 = local_1740._0_8_;
      uStack_2678 = local_1740._8_8_;
      uStack_2670 = local_1740._16_8_;
      uStack_2668 = local_1740._24_8_;
      uStack_2660 = local_1740._32_8_;
      uStack_2658 = local_1740._40_8_;
      uStack_2650 = local_1740._48_8_;
      uStack_2648 = local_1740._56_8_;
      local_1744 = 0x3f800000;
      local_17c0 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      local_26c0 = local_17c0._0_8_;
      uStack_26b8 = local_17c0._8_8_;
      uStack_26b0 = local_17c0._16_8_;
      uStack_26a8 = local_17c0._24_8_;
      uStack_26a0 = local_17c0._32_8_;
      uStack_2698 = local_17c0._40_8_;
      uStack_2690 = local_17c0._48_8_;
      uStack_2688 = local_17c0._56_8_;
      local_17c4 = 0x3cc48f19;
      local_1840 = vbroadcastss_avx512f(ZEXT416(0x3cc48f19));
      local_2700 = local_1840._0_8_;
      uStack_26f8 = local_1840._8_8_;
      uStack_26f0 = local_1840._16_8_;
      uStack_26e8 = local_1840._24_8_;
      uStack_26e0 = local_1840._32_8_;
      uStack_26d8 = local_1840._40_8_;
      uStack_26d0 = local_1840._48_8_;
      uStack_26c8 = local_1840._56_8_;
      local_1844 = 0x3d2dbdcf;
      local_18c0 = vbroadcastss_avx512f(ZEXT416(0x3d2dbdcf));
      local_2740 = local_18c0._0_8_;
      uStack_2738 = local_18c0._8_8_;
      uStack_2730 = local_18c0._16_8_;
      uStack_2728 = local_18c0._24_8_;
      uStack_2720 = local_18c0._32_8_;
      uStack_2718 = local_18c0._40_8_;
      uStack_2710 = local_18c0._48_8_;
      uStack_2708 = local_18c0._56_8_;
      local_18c4 = 0x3d997dcc;
      local_1940 = vbroadcastss_avx512f(ZEXT416(0x3d997dcc));
      local_2780 = local_1940._0_8_;
      uStack_2778 = local_1940._8_8_;
      uStack_2770 = local_1940._16_8_;
      uStack_2768 = local_1940._24_8_;
      uStack_2760 = local_1940._32_8_;
      uStack_2758 = local_1940._40_8_;
      uStack_2750 = local_1940._48_8_;
      uStack_2748 = local_1940._56_8_;
      local_1944 = 0x3d3a73d8;
      local_19c0 = vbroadcastss_avx512f(ZEXT416(0x3d3a73d8));
      local_27c0 = local_19c0._0_8_;
      uStack_27b8 = local_19c0._8_8_;
      uStack_27b0 = local_19c0._16_8_;
      uStack_27a8 = local_19c0._24_8_;
      uStack_27a0 = local_19c0._32_8_;
      uStack_2798 = local_19c0._40_8_;
      uStack_2790 = local_19c0._48_8_;
      uStack_2788 = local_19c0._56_8_;
      local_19c4 = 0x3f800000;
      local_1a40 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      local_2800 = local_1a40._0_8_;
      uStack_27f8 = local_1a40._8_8_;
      uStack_27f0 = local_1a40._16_8_;
      uStack_27e8 = local_1a40._24_8_;
      uStack_27e0 = local_1a40._32_8_;
      uStack_27d8 = local_1a40._40_8_;
      uStack_27d0 = local_1a40._48_8_;
      uStack_27c8 = local_1a40._56_8_;
      local_1a44 = 0x3e2aaaf8;
      local_1ac0 = vbroadcastss_avx512f(ZEXT416(0x3e2aaaf8));
      local_2840 = local_1ac0._0_8_;
      uStack_2838 = local_1ac0._8_8_;
      uStack_2830 = local_1ac0._16_8_;
      uStack_2828 = local_1ac0._24_8_;
      uStack_2820 = local_1ac0._32_8_;
      uStack_2818 = local_1ac0._40_8_;
      uStack_2810 = local_1ac0._48_8_;
      uStack_2808 = local_1ac0._56_8_;
      local_1ac4 = 0x3fc90fdb;
      local_1b40 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
      local_2880 = local_1b40._0_8_;
      uStack_2878 = local_1b40._8_8_;
      uStack_2870 = local_1b40._16_8_;
      uStack_2868 = local_1b40._24_8_;
      uStack_2860 = local_1b40._32_8_;
      uStack_2858 = local_1b40._40_8_;
      uStack_2850 = local_1b40._48_8_;
      uStack_2848 = local_1b40._56_8_;
      local_1b44 = 0x40400000;
      local_1bc0 = vbroadcastss_avx512f(ZEXT416(0x40400000));
      local_28c0 = local_1bc0._0_8_;
      uStack_28b8 = local_1bc0._8_8_;
      uStack_28b0 = local_1bc0._16_8_;
      uStack_28a8 = local_1bc0._24_8_;
      uStack_28a0 = local_1bc0._32_8_;
      uStack_2898 = local_1bc0._40_8_;
      uStack_2890 = local_1bc0._48_8_;
      uStack_2888 = local_1bc0._56_8_;
      local_2580 = local_16c0._0_8_;
      uStack_2578 = local_16c0._8_8_;
      uStack_2570 = local_16c0._16_8_;
      uStack_2568 = local_16c0._24_8_;
      uStack_2560 = local_16c0._32_8_;
      uStack_2558 = local_16c0._40_8_;
      uStack_2550 = local_16c0._48_8_;
      uStack_2548 = local_16c0._56_8_;
      auVar49 = vmovdqa64_avx512f(local_16c0);
      auVar50 = vmovdqa64_avx512f(auVar51);
      auVar49 = vpandd_avx512f(auVar49,auVar50);
      local_2900 = vmovdqa64_avx512f(auVar49);
      local_1c00 = local_16c0._0_8_;
      uStack_1bf8 = local_16c0._8_8_;
      uStack_1bf0 = local_16c0._16_8_;
      uStack_1be8 = local_16c0._24_8_;
      uStack_1be0 = local_16c0._32_8_;
      uStack_1bd8 = local_16c0._40_8_;
      uStack_1bd0 = local_16c0._48_8_;
      uStack_1bc8 = local_16c0._56_8_;
      auVar49 = vmovdqa64_avx512f(local_16c0);
      auVar51 = vmovdqa64_avx512f(auVar51);
      auVar51 = vpandnd_avx512f(auVar49,auVar51);
      local_2940 = vmovdqa64_avx512f(auVar51);
      uVar4 = vcmpps_avx512f(local_2940,local_1740,2);
      local_2942 = (ushort)uVar4;
      local_15c2 = ~local_2942;
      local_1640._0_4_ = local_17c0._0_4_;
      local_1640._4_4_ = local_17c0._4_4_;
      uStack_1638._0_4_ = local_17c0._8_4_;
      uStack_1638._4_4_ = local_17c0._12_4_;
      uStack_1630._0_4_ = local_17c0._16_4_;
      uStack_1630._4_4_ = local_17c0._20_4_;
      uStack_1628._0_4_ = local_17c0._24_4_;
      uStack_1628._4_4_ = local_17c0._28_4_;
      uStack_1620._0_4_ = local_17c0._32_4_;
      uStack_1620._4_4_ = local_17c0._36_4_;
      uStack_1618._0_4_ = local_17c0._40_4_;
      uStack_1618._4_4_ = local_17c0._44_4_;
      uStack_1610._0_4_ = local_17c0._48_4_;
      uStack_1610._4_4_ = local_17c0._52_4_;
      uStack_1608._0_4_ = local_17c0._56_4_;
      uStack_1608._4_4_ = local_17c0._60_4_;
      local_15c0 = 0;
      uStack_15b8 = 0;
      uStack_15b0 = 0;
      uStack_15a8 = 0;
      uStack_15a0 = 0;
      uStack_1598 = 0;
      uStack_1590 = 0;
      uStack_1588 = 0;
      local_29c0 = (uint)((byte)local_15c2 & 1) * (int)local_1640;
      iStack_29bc = (uint)((byte)(local_15c2 >> 1) & 1) * local_1640._4_4_;
      iStack_29b8 = (uint)((byte)(local_15c2 >> 2) & 1) * (int)uStack_1638;
      iStack_29b4 = (uint)((byte)(local_15c2 >> 3) & 1) * uStack_1638._4_4_;
      iStack_29b0 = (uint)((byte)(local_15c2 >> 4) & 1) * (int)uStack_1630;
      iStack_29ac = (uint)((byte)(local_15c2 >> 5) & 1) * uStack_1630._4_4_;
      iStack_29a8 = (uint)((byte)(local_15c2 >> 6) & 1) * (int)uStack_1628;
      iStack_29a4 = (uint)((byte)(local_15c2 >> 7) & 1) * uStack_1628._4_4_;
      bVar2 = (byte)(local_15c2 >> 8);
      iStack_29a0 = (uint)(bVar2 & 1) * (int)uStack_1620;
      iStack_299c = (uint)(bVar2 >> 1 & 1) * uStack_1620._4_4_;
      iStack_2998 = (uint)(bVar2 >> 2 & 1) * (int)uStack_1618;
      iStack_2994 = (uint)(bVar2 >> 3 & 1) * uStack_1618._4_4_;
      iStack_2990 = (uint)(bVar2 >> 4 & 1) * (int)uStack_1610;
      iStack_298c = (uint)(bVar2 >> 5 & 1) * uStack_1610._4_4_;
      iStack_2988 = (uint)(bVar2 >> 6 & 1) * (int)uStack_1608;
      iStack_2984 = (uint)(bVar2 >> 7) * uStack_1608._4_4_;
      local_2280 = local_1740._0_8_;
      uStack_2278 = local_1740._8_8_;
      uStack_2270 = local_1740._16_8_;
      uStack_2268 = local_1740._24_8_;
      uStack_2260 = local_1740._32_8_;
      uStack_2258 = local_1740._40_8_;
      uStack_2250 = local_1740._48_8_;
      uStack_2248 = local_1740._56_8_;
      local_2500 = local_17c0._0_8_;
      uStack_24f8 = local_17c0._8_8_;
      uStack_24f0 = local_17c0._16_8_;
      uStack_24e8 = local_17c0._24_8_;
      uStack_24e0 = local_17c0._32_8_;
      uStack_24d8 = local_17c0._40_8_;
      uStack_24d0 = local_17c0._48_8_;
      uStack_24c8 = local_17c0._56_8_;
      local_2540 = local_2940._0_8_;
      uStack_2538 = local_2940._8_8_;
      uStack_2530 = local_2940._16_8_;
      uStack_2528 = local_2940._24_8_;
      uStack_2520 = local_2940._32_8_;
      uStack_2518 = local_2940._40_8_;
      uStack_2510 = local_2940._48_8_;
      uStack_2508 = local_2940._56_8_;
      local_22c0 = vsubps_avx512f(local_17c0,local_2940);
      local_2240 = vmulps_avx512f(local_1740,local_22c0);
      local_2a00 = vsqrtps_avx512f(local_2240);
      local_1580._0_4_ = local_2940._0_4_;
      local_1580._4_4_ = local_2940._4_4_;
      uStack_1578._0_4_ = local_2940._8_4_;
      uStack_1578._4_4_ = local_2940._12_4_;
      uStack_1570._0_4_ = local_2940._16_4_;
      uStack_1570._4_4_ = local_2940._20_4_;
      uStack_1568._0_4_ = local_2940._24_4_;
      uStack_1568._4_4_ = local_2940._28_4_;
      uStack_1560._0_4_ = local_2940._32_4_;
      uStack_1560._4_4_ = local_2940._36_4_;
      uStack_1558._0_4_ = local_2940._40_4_;
      uStack_1558._4_4_ = local_2940._44_4_;
      uStack_1550._0_4_ = local_2940._48_4_;
      uStack_1550._4_4_ = local_2940._52_4_;
      uStack_1548._0_4_ = local_2940._56_4_;
      uStack_1548._4_4_ = local_2940._60_4_;
      local_1500._0_4_ = local_2a00._0_4_;
      local_1500._4_4_ = local_2a00._4_4_;
      uStack_14f8._0_4_ = local_2a00._8_4_;
      uStack_14f8._4_4_ = local_2a00._12_4_;
      uStack_14f0._0_4_ = local_2a00._16_4_;
      uStack_14f0._4_4_ = local_2a00._20_4_;
      uStack_14e8._0_4_ = local_2a00._24_4_;
      uStack_14e8._4_4_ = local_2a00._28_4_;
      uStack_14e0._0_4_ = local_2a00._32_4_;
      uStack_14e0._4_4_ = local_2a00._36_4_;
      uStack_14d8._0_4_ = local_2a00._40_4_;
      uStack_14d8._4_4_ = local_2a00._44_4_;
      uStack_14d0._0_4_ = local_2a00._48_4_;
      uStack_14d0._4_4_ = local_2a00._52_4_;
      uStack_14c8._0_4_ = local_2a00._56_4_;
      uStack_14c8._4_4_ = local_2a00._60_4_;
      bVar1 = (bool)((byte)uVar4 & 1);
      local_2a40 = (uint)bVar1 * (int)local_1580 | (uint)!bVar1 * (int)local_1500;
      bVar1 = (bool)((byte)(local_2942 >> 1) & 1);
      uStack_2a3c = (uint)bVar1 * local_1580._4_4_ | (uint)!bVar1 * local_1500._4_4_;
      bVar1 = (bool)((byte)(local_2942 >> 2) & 1);
      uStack_2a38 = (uint)bVar1 * (int)uStack_1578 | (uint)!bVar1 * (int)uStack_14f8;
      bVar1 = (bool)((byte)(local_2942 >> 3) & 1);
      uStack_2a34 = (uint)bVar1 * uStack_1578._4_4_ | (uint)!bVar1 * uStack_14f8._4_4_;
      bVar1 = (bool)((byte)(local_2942 >> 4) & 1);
      uStack_2a30 = (uint)bVar1 * (int)uStack_1570 | (uint)!bVar1 * (int)uStack_14f0;
      bVar1 = (bool)((byte)(local_2942 >> 5) & 1);
      uStack_2a2c = (uint)bVar1 * uStack_1570._4_4_ | (uint)!bVar1 * uStack_14f0._4_4_;
      bVar1 = (bool)((byte)(local_2942 >> 6) & 1);
      uStack_2a28 = (uint)bVar1 * (int)uStack_1568 | (uint)!bVar1 * (int)uStack_14e8;
      bVar1 = (bool)((byte)(local_2942 >> 7) & 1);
      uStack_2a24 = (uint)bVar1 * uStack_1568._4_4_ | (uint)!bVar1 * uStack_14e8._4_4_;
      bVar2 = (byte)((ulong)uVar4 >> 8);
      uStack_2a20 = (uint)(bVar2 & 1) * (int)uStack_1560 |
                    (uint)!(bool)(bVar2 & 1) * (int)uStack_14e0;
      bVar1 = (bool)(bVar2 >> 1 & 1);
      uStack_2a1c = (uint)bVar1 * uStack_1560._4_4_ | (uint)!bVar1 * uStack_14e0._4_4_;
      bVar1 = (bool)(bVar2 >> 2 & 1);
      uStack_2a18 = (uint)bVar1 * (int)uStack_1558 | (uint)!bVar1 * (int)uStack_14d8;
      bVar1 = (bool)(bVar2 >> 3 & 1);
      uStack_2a14 = (uint)bVar1 * uStack_1558._4_4_ | (uint)!bVar1 * uStack_14d8._4_4_;
      bVar1 = (bool)(bVar2 >> 4 & 1);
      uStack_2a10 = (uint)bVar1 * (int)uStack_1550 | (uint)!bVar1 * (int)uStack_14d0;
      bVar1 = (bool)(bVar2 >> 5 & 1);
      uStack_2a0c = (uint)bVar1 * uStack_1550._4_4_ | (uint)!bVar1 * uStack_14d0._4_4_;
      bVar1 = (bool)(bVar2 >> 6 & 1);
      uStack_2a08 = (uint)bVar1 * (int)uStack_1548 | (uint)!bVar1 * (int)uStack_14c8;
      uStack_2a04 = (uint)(bVar2 >> 7) * uStack_1548._4_4_ |
                    (uint)!(bool)(bVar2 >> 7) * uStack_14c8._4_4_;
      local_2340 = CONCAT44(uStack_2a3c,local_2a40);
      uStack_2338 = CONCAT44(uStack_2a34,uStack_2a38);
      uStack_2330 = CONCAT44(uStack_2a2c,uStack_2a30);
      uStack_2328 = CONCAT44(uStack_2a24,uStack_2a28);
      uStack_2320 = CONCAT44(uStack_2a1c,uStack_2a20);
      uStack_2318 = CONCAT44(uStack_2a14,uStack_2a18);
      uStack_2310 = CONCAT44(uStack_2a0c,uStack_2a10);
      uStack_2308 = CONCAT44(uStack_2a04,uStack_2a08);
      auVar12._8_8_ = uStack_2338;
      auVar12._0_8_ = local_2340;
      auVar12._16_8_ = uStack_2330;
      auVar12._24_8_ = uStack_2328;
      auVar12._32_8_ = uStack_2320;
      auVar12._40_8_ = uStack_2318;
      auVar12._48_8_ = uStack_2310;
      auVar12._56_8_ = uStack_2308;
      auVar50._8_8_ = uStack_2338;
      auVar50._0_8_ = local_2340;
      auVar50._16_8_ = uStack_2330;
      auVar50._24_8_ = uStack_2328;
      auVar50._32_8_ = uStack_2320;
      auVar50._40_8_ = uStack_2318;
      auVar50._48_8_ = uStack_2310;
      auVar50._56_8_ = uStack_2308;
      local_2a80 = vmulps_avx512f(auVar12,auVar50);
      local_23c0 = local_2a80._0_8_;
      uStack_23b8 = local_2a80._8_8_;
      uStack_23b0 = local_2a80._16_8_;
      uStack_23a8 = local_2a80._24_8_;
      uStack_23a0 = local_2a80._32_8_;
      uStack_2398 = local_2a80._40_8_;
      uStack_2390 = local_2a80._48_8_;
      uStack_2388 = local_2a80._56_8_;
      local_2ac0 = vmulps_avx512f(local_2a80,local_2a80);
      local_20c0 = local_2a80._0_8_;
      uStack_20b8 = local_2a80._8_8_;
      uStack_20b0 = local_2a80._16_8_;
      uStack_20a8 = local_2a80._24_8_;
      uStack_20a0 = local_2a80._32_8_;
      uStack_2098 = local_2a80._40_8_;
      uStack_2090 = local_2a80._48_8_;
      uStack_2088 = local_2a80._56_8_;
      local_1e80 = local_2ac0._0_8_;
      uStack_1e78 = local_2ac0._8_8_;
      uStack_1e70 = local_2ac0._16_8_;
      uStack_1e68 = local_2ac0._24_8_;
      uStack_1e60 = local_2ac0._32_8_;
      uStack_1e58 = local_2ac0._40_8_;
      uStack_1e50 = local_2ac0._48_8_;
      uStack_1e48 = local_2ac0._56_8_;
      local_1e00 = local_18c0._0_8_;
      uStack_1df8 = local_18c0._8_8_;
      uStack_1df0 = local_18c0._16_8_;
      uStack_1de8 = local_18c0._24_8_;
      uStack_1de0 = local_18c0._32_8_;
      uStack_1dd8 = local_18c0._40_8_;
      uStack_1dd0 = local_18c0._48_8_;
      uStack_1dc8 = local_18c0._56_8_;
      local_1e40 = local_19c0._0_8_;
      uStack_1e38 = local_19c0._8_8_;
      uStack_1e30 = local_19c0._16_8_;
      uStack_1e28 = local_19c0._24_8_;
      uStack_1e20 = local_19c0._32_8_;
      uStack_1e18 = local_19c0._40_8_;
      uStack_1e10 = local_19c0._48_8_;
      uStack_1e08 = local_19c0._56_8_;
      local_1ec0 = vfmadd213ps_avx512f(local_18c0,local_2ac0,local_19c0);
      local_1f00 = local_1ac0._0_8_;
      uStack_1ef8 = local_1ac0._8_8_;
      uStack_1ef0 = local_1ac0._16_8_;
      uStack_1ee8 = local_1ac0._24_8_;
      uStack_1ee0 = local_1ac0._32_8_;
      uStack_1ed8 = local_1ac0._40_8_;
      uStack_1ed0 = local_1ac0._48_8_;
      uStack_1ec8 = local_1ac0._56_8_;
      local_2100 = vfmadd213ps_avx512f(local_1ec0,local_2ac0,local_1ac0);
      local_2000 = local_2ac0._0_8_;
      uStack_1ff8 = local_2ac0._8_8_;
      uStack_1ff0 = local_2ac0._16_8_;
      uStack_1fe8 = local_2ac0._24_8_;
      uStack_1fe0 = local_2ac0._32_8_;
      uStack_1fd8 = local_2ac0._40_8_;
      uStack_1fd0 = local_2ac0._48_8_;
      uStack_1fc8 = local_2ac0._56_8_;
      local_1f80 = local_1840._0_8_;
      uStack_1f78 = local_1840._8_8_;
      uStack_1f70 = local_1840._16_8_;
      uStack_1f68 = local_1840._24_8_;
      uStack_1f60 = local_1840._32_8_;
      uStack_1f58 = local_1840._40_8_;
      uStack_1f50 = local_1840._48_8_;
      uStack_1f48 = local_1840._56_8_;
      local_1fc0 = local_1940._0_8_;
      uStack_1fb8 = local_1940._8_8_;
      uStack_1fb0 = local_1940._16_8_;
      uStack_1fa8 = local_1940._24_8_;
      uStack_1fa0 = local_1940._32_8_;
      uStack_1f98 = local_1940._40_8_;
      uStack_1f90 = local_1940._48_8_;
      uStack_1f88 = local_1940._56_8_;
      local_2040 = vfmadd213ps_avx512f(local_1840,local_2ac0,local_1940);
      local_2080 = local_1a40._0_8_;
      uStack_2078 = local_1a40._8_8_;
      uStack_2070 = local_1a40._16_8_;
      uStack_2068 = local_1a40._24_8_;
      uStack_2060 = local_1a40._32_8_;
      uStack_2058 = local_1a40._40_8_;
      uStack_2050 = local_1a40._48_8_;
      uStack_2048 = local_1a40._56_8_;
      local_2140 = vfmadd213ps_avx512f(local_2040,local_2ac0,local_1a40);
      local_2b00 = vfmadd213ps_avx512f(local_2100,local_2a80,local_2140);
      local_2400 = local_2b00._0_8_;
      uStack_23f8 = local_2b00._8_8_;
      uStack_23f0 = local_2b00._16_8_;
      uStack_23e8 = local_2b00._24_8_;
      uStack_23e0 = local_2b00._32_8_;
      uStack_23d8 = local_2b00._40_8_;
      uStack_23d0 = local_2b00._48_8_;
      uStack_23c8 = local_2b00._56_8_;
      local_2440 = CONCAT44(uStack_2a3c,local_2a40);
      uStack_2438 = CONCAT44(uStack_2a34,uStack_2a38);
      uStack_2430 = CONCAT44(uStack_2a2c,uStack_2a30);
      uStack_2428 = CONCAT44(uStack_2a24,uStack_2a28);
      uStack_2420 = CONCAT44(uStack_2a1c,uStack_2a20);
      uStack_2418 = CONCAT44(uStack_2a14,uStack_2a18);
      uStack_2410 = CONCAT44(uStack_2a0c,uStack_2a10);
      uStack_2408 = CONCAT44(uStack_2a04,uStack_2a08);
      auVar49._8_8_ = uStack_2438;
      auVar49._0_8_ = local_2440;
      auVar49._16_8_ = uStack_2430;
      auVar49._24_8_ = uStack_2428;
      auVar49._32_8_ = uStack_2420;
      auVar49._40_8_ = uStack_2418;
      auVar49._48_8_ = uStack_2410;
      auVar49._56_8_ = uStack_2408;
      local_2180 = vmulps_avx512f(local_2b00,auVar49);
      local_1d00 = local_1bc0._0_8_;
      uStack_1cf8 = local_1bc0._8_8_;
      uStack_1cf0 = local_1bc0._16_8_;
      uStack_1ce8 = local_1bc0._24_8_;
      uStack_1ce0 = local_1bc0._32_8_;
      uStack_1cd8 = local_1bc0._40_8_;
      uStack_1cd0 = local_1bc0._48_8_;
      uStack_1cc8 = local_1bc0._56_8_;
      local_1d40 = CONCAT44(iStack_29bc,local_29c0);
      uStack_1d38 = CONCAT44(iStack_29b4,iStack_29b8);
      uStack_1d30 = CONCAT44(iStack_29ac,iStack_29b0);
      uStack_1d28 = CONCAT44(iStack_29a4,iStack_29a8);
      uStack_1d20 = CONCAT44(iStack_299c,iStack_29a0);
      uStack_1d18 = CONCAT44(iStack_2994,iStack_2998);
      uStack_1d10 = CONCAT44(iStack_298c,iStack_2990);
      uStack_1d08 = CONCAT44(iStack_2984,iStack_2988);
      local_1d80 = local_17c0._0_8_;
      uStack_1d78 = local_17c0._8_8_;
      uStack_1d70 = local_17c0._16_8_;
      uStack_1d68 = local_17c0._24_8_;
      uStack_1d60 = local_17c0._32_8_;
      uStack_1d58 = local_17c0._40_8_;
      uStack_1d50 = local_17c0._48_8_;
      uStack_1d48 = local_17c0._56_8_;
      auVar13._8_8_ = uStack_1d38;
      auVar13._0_8_ = local_1d40;
      auVar13._16_8_ = uStack_1d30;
      auVar13._24_8_ = uStack_1d28;
      auVar13._32_8_ = uStack_1d20;
      auVar13._40_8_ = uStack_1d18;
      auVar13._48_8_ = uStack_1d10;
      auVar13._56_8_ = uStack_1d08;
      auVar51 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
      auVar51 = vpxord_avx512f(auVar13,auVar51);
      local_21c0 = vfmadd213ps_avx512f(auVar51,local_1bc0,local_17c0);
      local_2480 = local_1b40._0_8_;
      uStack_2478 = local_1b40._8_8_;
      uStack_2470 = local_1b40._16_8_;
      uStack_2468 = local_1b40._24_8_;
      uStack_2460 = local_1b40._32_8_;
      uStack_2458 = local_1b40._40_8_;
      uStack_2450 = local_1b40._48_8_;
      uStack_2448 = local_1b40._56_8_;
      local_24c0 = CONCAT44(iStack_29bc,local_29c0);
      uStack_24b8 = CONCAT44(iStack_29b4,iStack_29b8);
      uStack_24b0 = CONCAT44(iStack_29ac,iStack_29b0);
      uStack_24a8 = CONCAT44(iStack_29a4,iStack_29a8);
      uStack_24a0 = CONCAT44(iStack_299c,iStack_29a0);
      uStack_2498 = CONCAT44(iStack_2994,iStack_2998);
      uStack_2490 = CONCAT44(iStack_298c,iStack_2990);
      uStack_2488 = CONCAT44(iStack_2984,iStack_2988);
      auVar51._8_8_ = uStack_24b8;
      auVar51._0_8_ = local_24c0;
      auVar51._16_8_ = uStack_24b0;
      auVar51._24_8_ = uStack_24a8;
      auVar51._32_8_ = uStack_24a0;
      auVar51._40_8_ = uStack_2498;
      auVar51._48_8_ = uStack_2490;
      auVar51._56_8_ = uStack_2488;
      local_2200 = vmulps_avx512f(local_1b40,auVar51);
      local_2b40 = vfmadd213ps_avx512f(local_21c0,local_2180,local_2200);
      local_1c80 = local_2b40._0_8_;
      uStack_1c78 = local_2b40._8_8_;
      uStack_1c70 = local_2b40._16_8_;
      uStack_1c68 = local_2b40._24_8_;
      uStack_1c60 = local_2b40._32_8_;
      uStack_1c58 = local_2b40._40_8_;
      uStack_1c50 = local_2b40._48_8_;
      uStack_1c48 = local_2b40._56_8_;
      local_1cc0 = local_2900._0_8_;
      uStack_1cb8 = local_2900._8_8_;
      uStack_1cb0 = local_2900._16_8_;
      uStack_1ca8 = local_2900._24_8_;
      uStack_1ca0 = local_2900._32_8_;
      uStack_1c98 = local_2900._40_8_;
      uStack_1c90 = local_2900._48_8_;
      uStack_1c88 = local_2900._56_8_;
      local_2dc0 = vpord_avx512f(local_2b40,local_2900);
      local_2c50 = local_2d30;
      local_2cc0 = local_2dc0._0_8_;
      uStack_2cb8 = local_2dc0._8_8_;
      uStack_2cb0 = local_2dc0._16_8_;
      uStack_2ca8 = local_2dc0._24_8_;
      uStack_2ca0 = local_2dc0._32_8_;
      uStack_2c98 = local_2dc0._40_8_;
      uStack_2c90 = local_2dc0._48_8_;
      uStack_2c88 = local_2dc0._56_8_;
      *local_2d30 = local_2dc0;
      local_2d30 = local_2d30 + 1;
      local_25c0 = local_2600;
      uStack_25b8 = uStack_25f8;
      uStack_25b0 = uStack_25f0;
      uStack_25a8 = uStack_25e8;
      uStack_25a0 = uStack_25e0;
      uStack_2598 = uStack_25d8;
      uStack_2590 = uStack_25d0;
      uStack_2588 = uStack_25c8;
      local_2380 = local_23c0;
      uStack_2378 = uStack_23b8;
      uStack_2370 = uStack_23b0;
      uStack_2368 = uStack_23a8;
      uStack_2360 = uStack_23a0;
      uStack_2358 = uStack_2398;
      uStack_2350 = uStack_2390;
      uStack_2348 = uStack_2388;
      local_2300 = local_2340;
      uStack_22f8 = uStack_2338;
      uStack_22f0 = uStack_2330;
      uStack_22e8 = uStack_2328;
      uStack_22e0 = uStack_2320;
      uStack_22d8 = uStack_2318;
      uStack_22d0 = uStack_2310;
      uStack_22c8 = uStack_2308;
      local_1f40 = local_2000;
      uStack_1f38 = uStack_1ff8;
      uStack_1f30 = uStack_1ff0;
      uStack_1f28 = uStack_1fe8;
      uStack_1f20 = uStack_1fe0;
      uStack_1f18 = uStack_1fd8;
      uStack_1f10 = uStack_1fd0;
      uStack_1f08 = uStack_1fc8;
      local_1dc0 = local_1e80;
      uStack_1db8 = uStack_1e78;
      uStack_1db0 = uStack_1e70;
      uStack_1da8 = uStack_1e68;
      uStack_1da0 = uStack_1e60;
      uStack_1d98 = uStack_1e58;
      uStack_1d90 = uStack_1e50;
      uStack_1d88 = uStack_1e48;
      local_1c40 = local_2600;
      uStack_1c38 = uStack_25f8;
      uStack_1c30 = uStack_25f0;
      uStack_1c28 = uStack_25e8;
      uStack_1c20 = uStack_25e0;
      uStack_1c18 = uStack_25d8;
      uStack_1c10 = uStack_25d0;
      uStack_1c08 = uStack_25c8;
      local_1640 = local_17c0._0_8_;
      uStack_1638 = local_17c0._8_8_;
      uStack_1630 = local_17c0._16_8_;
      uStack_1628 = local_17c0._24_8_;
      uStack_1620 = local_17c0._32_8_;
      uStack_1618 = local_17c0._40_8_;
      uStack_1610 = local_17c0._48_8_;
      uStack_1608 = local_17c0._56_8_;
      local_1580 = local_2940._0_8_;
      uStack_1578 = local_2940._8_8_;
      uStack_1570 = local_2940._16_8_;
      uStack_1568 = local_2940._24_8_;
      uStack_1560 = local_2940._32_8_;
      uStack_1558 = local_2940._40_8_;
      uStack_1550 = local_2940._48_8_;
      uStack_1548 = local_2940._56_8_;
      local_1502 = local_2942;
      local_1500 = local_2a00._0_8_;
      uStack_14f8 = local_2a00._8_8_;
      uStack_14f0 = local_2a00._16_8_;
      uStack_14e8 = local_2a00._24_8_;
      uStack_14e0 = local_2a00._32_8_;
      uStack_14d8 = local_2a00._40_8_;
      uStack_14d0 = local_2a00._48_8_;
      uStack_14c8 = local_2a00._56_8_;
    }
    for (; local_2d7c + 7 < local_2d24; local_2d7c = local_2d7c + 8) {
      local_2c48 = local_2d30;
      auVar14 = *(undefined1 (*) [32])*local_2d30;
      local_2b68 = local_2d09;
      local_2b70 = local_2de0;
      local_2de0._0_8_ = auVar14._0_8_;
      local_1140 = local_2de0._0_8_;
      local_2de0._8_8_ = auVar14._8_8_;
      uStack_1138 = local_2de0._8_8_;
      local_2de0._16_8_ = auVar14._16_8_;
      uStack_1130 = local_2de0._16_8_;
      local_2de0._24_8_ = auVar14._24_8_;
      uStack_1128 = local_2de0._24_8_;
      local_a24 = 0x80000000;
      local_a00 = 0x80000000;
      auVar3 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x80000000),0x20);
      local_a20 = vinsertps_avx(auVar3,ZEXT416(0x80000000),0x30);
      auVar3 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x80000000),0x20);
      auStack_a10 = vinsertps_avx(auVar3,ZEXT416(0x80000000),0x30);
      local_1160 = local_a20._0_8_;
      uStack_1158 = local_a20._8_8_;
      uStack_1150 = auStack_a10._0_8_;
      uStack_1148 = auStack_a10._8_8_;
      local_a28 = 0x3f000000;
      local_9c0 = 0x3f000000;
      auVar3 = vinsertps_avx(ZEXT416(0x3f000000),ZEXT416(0x3f000000),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3f000000),0x20);
      local_9e0 = vinsertps_avx(auVar3,ZEXT416(0x3f000000),0x30);
      auVar3 = vinsertps_avx(ZEXT416(0x3f000000),ZEXT416(0x3f000000),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3f000000),0x20);
      auStack_9d0 = vinsertps_avx(auVar3,ZEXT416(0x3f000000),0x30);
      local_1180 = local_9e0._0_8_;
      uStack_1178 = local_9e0._8_8_;
      uStack_1170 = auStack_9d0._0_8_;
      uStack_1168 = auStack_9d0._8_8_;
      local_a2c = 0x3f800000;
      local_980 = 0x3f800000;
      auVar3 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3f800000),0x20);
      local_9a0 = vinsertps_avx(auVar3,ZEXT416(0x3f800000),0x30);
      auVar3 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3f800000),0x20);
      auStack_990 = vinsertps_avx(auVar3,ZEXT416(0x3f800000),0x30);
      local_11a0 = local_9a0._0_8_;
      uStack_1198 = local_9a0._8_8_;
      uStack_1190 = auStack_990._0_8_;
      uStack_1188 = auStack_990._8_8_;
      local_a30 = 0x3cc48f19;
      local_940 = 0x3cc48f19;
      auVar3 = vinsertps_avx(ZEXT416(0x3cc48f19),ZEXT416(0x3cc48f19),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3cc48f19),0x20);
      local_960 = vinsertps_avx(auVar3,ZEXT416(0x3cc48f19),0x30);
      auVar3 = vinsertps_avx(ZEXT416(0x3cc48f19),ZEXT416(0x3cc48f19),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3cc48f19),0x20);
      auStack_950 = vinsertps_avx(auVar3,ZEXT416(0x3cc48f19),0x30);
      local_11c0 = local_960._0_8_;
      uStack_11b8 = local_960._8_8_;
      uStack_11b0 = auStack_950._0_8_;
      uStack_11a8 = auStack_950._8_8_;
      local_a34 = 0x3d2dbdcf;
      local_900 = 0x3d2dbdcf;
      auVar3 = vinsertps_avx(ZEXT416(0x3d2dbdcf),ZEXT416(0x3d2dbdcf),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3d2dbdcf),0x20);
      local_920 = vinsertps_avx(auVar3,ZEXT416(0x3d2dbdcf),0x30);
      auVar3 = vinsertps_avx(ZEXT416(0x3d2dbdcf),ZEXT416(0x3d2dbdcf),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3d2dbdcf),0x20);
      auStack_910 = vinsertps_avx(auVar3,ZEXT416(0x3d2dbdcf),0x30);
      local_11e0 = local_920._0_8_;
      uStack_11d8 = local_920._8_8_;
      uStack_11d0 = auStack_910._0_8_;
      uStack_11c8 = auStack_910._8_8_;
      local_a38 = 0x3d997dcc;
      local_8c0 = 0x3d997dcc;
      auVar3 = vinsertps_avx(ZEXT416(0x3d997dcc),ZEXT416(0x3d997dcc),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3d997dcc),0x20);
      local_8e0 = vinsertps_avx(auVar3,ZEXT416(0x3d997dcc),0x30);
      auVar3 = vinsertps_avx(ZEXT416(0x3d997dcc),ZEXT416(0x3d997dcc),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3d997dcc),0x20);
      auStack_8d0 = vinsertps_avx(auVar3,ZEXT416(0x3d997dcc),0x30);
      local_1200 = local_8e0._0_8_;
      uStack_11f8 = local_8e0._8_8_;
      uStack_11f0 = auStack_8d0._0_8_;
      uStack_11e8 = auStack_8d0._8_8_;
      local_a3c = 0x3d3a73d8;
      local_880 = 0x3d3a73d8;
      auVar3 = vinsertps_avx(ZEXT416(0x3d3a73d8),ZEXT416(0x3d3a73d8),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3d3a73d8),0x20);
      local_8a0 = vinsertps_avx(auVar3,ZEXT416(0x3d3a73d8),0x30);
      auVar3 = vinsertps_avx(ZEXT416(0x3d3a73d8),ZEXT416(0x3d3a73d8),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3d3a73d8),0x20);
      auStack_890 = vinsertps_avx(auVar3,ZEXT416(0x3d3a73d8),0x30);
      local_1220 = local_8a0._0_8_;
      uStack_1218 = local_8a0._8_8_;
      uStack_1210 = auStack_890._0_8_;
      uStack_1208 = auStack_890._8_8_;
      local_a40 = 0x3f800000;
      local_840 = 0x3f800000;
      auVar3 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3f800000),0x20);
      local_860 = vinsertps_avx(auVar3,ZEXT416(0x3f800000),0x30);
      auVar3 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3f800000),0x20);
      auStack_850 = vinsertps_avx(auVar3,ZEXT416(0x3f800000),0x30);
      local_1240 = local_860._0_8_;
      uStack_1238 = local_860._8_8_;
      uStack_1230 = auStack_850._0_8_;
      uStack_1228 = auStack_850._8_8_;
      local_a44 = 0x3e2aaaf8;
      local_800 = 0x3e2aaaf8;
      auVar3 = vinsertps_avx(ZEXT416(0x3e2aaaf8),ZEXT416(0x3e2aaaf8),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3e2aaaf8),0x20);
      local_820 = vinsertps_avx(auVar3,ZEXT416(0x3e2aaaf8),0x30);
      auVar3 = vinsertps_avx(ZEXT416(0x3e2aaaf8),ZEXT416(0x3e2aaaf8),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3e2aaaf8),0x20);
      auStack_810 = vinsertps_avx(auVar3,ZEXT416(0x3e2aaaf8),0x30);
      local_1260 = local_820._0_8_;
      uStack_1258 = local_820._8_8_;
      uStack_1250 = auStack_810._0_8_;
      uStack_1248 = auStack_810._8_8_;
      local_a48 = 0x3fc90fdb;
      local_7c0 = 0x3fc90fdb;
      auVar3 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3fc90fdb),0x20);
      local_7e0 = vinsertps_avx(auVar3,ZEXT416(0x3fc90fdb),0x30);
      auVar3 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3fc90fdb),0x20);
      auStack_7d0 = vinsertps_avx(auVar3,ZEXT416(0x3fc90fdb),0x30);
      local_1280 = local_7e0._0_8_;
      uStack_1278 = local_7e0._8_8_;
      uStack_1270 = auStack_7d0._0_8_;
      uStack_1268 = auStack_7d0._8_8_;
      local_a4c = 0x40400000;
      local_780 = 0x40400000;
      auVar3 = vinsertps_avx(ZEXT416(0x40400000),ZEXT416(0x40400000),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x40400000),0x20);
      local_7a0 = vinsertps_avx(auVar3,ZEXT416(0x40400000),0x30);
      auVar3 = vinsertps_avx(ZEXT416(0x40400000),ZEXT416(0x40400000),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x40400000),0x20);
      auStack_790 = vinsertps_avx(auVar3,ZEXT416(0x40400000),0x30);
      local_12a0 = local_7a0._0_8_;
      uStack_1298 = local_7a0._8_8_;
      uStack_1290 = auStack_790._0_8_;
      uStack_1288 = auStack_790._8_8_;
      local_10c0 = local_a20._0_8_;
      uStack_10b8 = local_a20._8_8_;
      uStack_10b0 = auStack_a10._0_8_;
      uStack_10a8 = auStack_a10._8_8_;
      auVar15._16_8_ = auStack_a10._0_8_;
      auVar15._0_16_ = local_a20;
      auVar15._24_8_ = auStack_a10._8_8_;
      local_12c0 = vpand_avx2(auVar15,auVar14);
      local_a80 = local_a20._0_8_;
      uStack_a78 = local_a20._8_8_;
      uStack_a70 = auStack_a10._0_8_;
      uStack_a68 = auStack_a10._8_8_;
      auVar19._16_8_ = auStack_a10._0_8_;
      auVar19._0_16_ = local_a20;
      auVar19._24_8_ = auStack_a10._8_8_;
      local_12e0 = vpandn_avx2(auVar19,auVar14);
      auVar14._16_8_ = auStack_9d0._0_8_;
      auVar14._0_16_ = local_9e0;
      auVar14._24_8_ = auStack_9d0._8_8_;
      local_1300 = vcmpps_avx(local_12e0,auVar14,2);
      local_ac0 = local_1300._0_8_;
      uStack_ab8 = local_1300._8_8_;
      uStack_ab0 = local_1300._16_8_;
      uStack_aa8 = local_1300._24_8_;
      local_ae0 = local_9a0._0_8_;
      uStack_ad8 = local_9a0._8_8_;
      uStack_ad0 = auStack_990._0_8_;
      uStack_ac8 = auStack_990._8_8_;
      auVar18._16_8_ = auStack_990._0_8_;
      auVar18._0_16_ = local_9a0;
      auVar18._24_8_ = auStack_990._8_8_;
      local_1320 = vpandn_avx2(local_1300,auVar18);
      local_1080 = local_9a0._0_8_;
      uStack_1078 = local_9a0._8_8_;
      uStack_1070 = auStack_990._0_8_;
      uStack_1068 = auStack_990._8_8_;
      local_10a0 = local_12e0._0_8_;
      uStack_1098 = local_12e0._8_8_;
      uStack_1090 = local_12e0._16_8_;
      uStack_1088 = local_12e0._24_8_;
      auVar16._16_8_ = auStack_990._0_8_;
      auVar16._0_16_ = local_9a0;
      auVar16._24_8_ = auStack_990._8_8_;
      _local_f60 = vsubps_avx(auVar16,local_12e0);
      local_f40._0_4_ = local_9e0._0_4_;
      local_f40._4_4_ = local_9e0._4_4_;
      uStack_f38._0_4_ = local_9e0._8_4_;
      uStack_f38._4_4_ = local_9e0._12_4_;
      uStack_f30._0_4_ = auStack_9d0._0_4_;
      uStack_f30._4_4_ = auStack_9d0._4_4_;
      uStack_f28._0_4_ = auStack_9d0._8_4_;
      uStack_f28._4_4_ = auStack_9d0._12_4_;
      uStack_f04 = uStack_f28._4_4_;
      local_f20 = (float)local_f40 * (float)local_f60._0_4_;
      fStack_f1c = local_f40._4_4_ * (float)local_f60._4_4_;
      fStack_f18 = (float)uStack_f38 * fStack_f58;
      fStack_f14 = uStack_f38._4_4_ * fStack_f54;
      fStack_f10 = (float)uStack_f30 * fStack_f50;
      fStack_f0c = uStack_f30._4_4_ * fStack_f4c;
      fStack_f08 = (float)uStack_f28 * fStack_f48;
      auVar17._4_4_ = fStack_f1c;
      auVar17._0_4_ = local_f20;
      auVar17._8_4_ = fStack_f18;
      auVar17._12_4_ = fStack_f14;
      auVar17._16_4_ = fStack_f10;
      auVar17._20_4_ = fStack_f0c;
      auVar17._24_4_ = fStack_f08;
      auVar17._28_4_ = uStack_f28._4_4_;
      local_1340 = vsqrtps_avx(auVar17);
      local_1100 = local_1300._0_8_;
      uStack_10f8 = local_1300._8_8_;
      uStack_10f0 = local_1300._16_8_;
      uStack_10e8 = local_1300._24_8_;
      local_1120 = local_12e0._0_8_;
      uStack_1118 = local_12e0._8_8_;
      uStack_1110 = local_12e0._16_8_;
      uStack_1108 = local_12e0._24_8_;
      local_b40 = vpand_avx2(local_1300,local_12e0);
      local_b00 = local_1300._0_8_;
      uStack_af8 = local_1300._8_8_;
      uStack_af0 = local_1300._16_8_;
      uStack_ae8 = local_1300._24_8_;
      local_b20 = local_1340._0_8_;
      uStack_b18 = local_1340._8_8_;
      uStack_b10 = local_1340._16_8_;
      uStack_b08 = local_1340._24_8_;
      local_b60 = vpandn_avx2(local_1300,local_1340);
      local_1360 = vpor_avx2(local_b40,local_b60);
      local_fa0 = local_1360._0_8_;
      uStack_f98 = local_1360._8_8_;
      uStack_f90 = local_1360._16_8_;
      uStack_f88 = local_1360._24_8_;
      local_f80._0_4_ = local_1360._0_4_;
      local_f80._4_4_ = local_1360._4_4_;
      uStack_f78._0_4_ = local_1360._8_4_;
      uStack_f78._4_4_ = local_1360._12_4_;
      uStack_f70._0_4_ = local_1360._16_4_;
      uStack_f70._4_4_ = local_1360._20_4_;
      uStack_f68._0_4_ = local_1360._24_4_;
      uStack_f68._4_4_ = local_1360._28_4_;
      uStack_1364 = uStack_f68._4_4_;
      local_1380 = (float)local_f80 * (float)local_f80;
      fStack_137c = local_f80._4_4_ * local_f80._4_4_;
      fStack_1378 = (float)uStack_f78 * (float)uStack_f78;
      fStack_1374 = uStack_f78._4_4_ * uStack_f78._4_4_;
      fStack_1370 = (float)uStack_f70 * (float)uStack_f70;
      fStack_136c = uStack_f70._4_4_ * uStack_f70._4_4_;
      fStack_1368 = (float)uStack_f68 * (float)uStack_f68;
      local_fe0 = CONCAT44(fStack_137c,local_1380);
      uStack_fd8 = CONCAT44(fStack_1374,fStack_1378);
      uStack_fd0 = CONCAT44(fStack_136c,fStack_1370);
      uStack_fc8 = CONCAT44(uStack_f68._4_4_,fStack_1368);
      uStack_1384 = uStack_f68._4_4_;
      local_13a0 = local_1380 * local_1380;
      fStack_139c = fStack_137c * fStack_137c;
      fStack_1398 = fStack_1378 * fStack_1378;
      fStack_1394 = fStack_1374 * fStack_1374;
      fStack_1390 = fStack_1370 * fStack_1370;
      fStack_138c = fStack_136c * fStack_136c;
      fStack_1388 = fStack_1368 * fStack_1368;
      local_ea8 = &local_13a0;
      local_e68 = &local_11e0;
      local_e70 = &local_1220;
      local_e00 = CONCAT44(fStack_139c,local_13a0);
      uStack_df8 = CONCAT44(fStack_1394,fStack_1398);
      uStack_df0 = CONCAT44(fStack_138c,fStack_1390);
      uStack_de8 = CONCAT44(uStack_f68._4_4_,fStack_1388);
      auVar22._4_4_ = fStack_139c;
      auVar22._0_4_ = local_13a0;
      auVar22._8_4_ = fStack_1398;
      auVar22._12_4_ = fStack_1394;
      auVar22._16_4_ = fStack_1390;
      auVar22._20_4_ = fStack_138c;
      auVar22._24_4_ = fStack_1388;
      auVar22._28_4_ = uStack_f68._4_4_;
      local_e20 = local_920._0_8_;
      uStack_e18 = local_920._8_8_;
      uStack_e10 = auStack_910._0_8_;
      uStack_e08 = auStack_910._8_8_;
      auVar32._16_8_ = auStack_910._0_8_;
      auVar32._0_16_ = local_920;
      auVar32._24_8_ = auStack_910._8_8_;
      local_e40 = local_8a0._0_8_;
      uStack_e38 = local_8a0._8_8_;
      uStack_e30 = auStack_890._0_8_;
      uStack_e28 = auStack_890._8_8_;
      auVar30._16_8_ = auStack_890._0_8_;
      auVar30._0_16_ = local_8a0;
      auVar30._24_8_ = auStack_890._8_8_;
      auVar3 = vfmadd213ps_fma(auVar32,auVar22,auVar30);
      local_e80 = local_1400;
      local_e88 = &local_1260;
      local_da0 = CONCAT44(fStack_139c,local_13a0);
      uStack_d98 = CONCAT44(fStack_1394,fStack_1398);
      uStack_d90 = CONCAT44(fStack_138c,fStack_1390);
      uStack_d88 = CONCAT44(uStack_f68._4_4_,fStack_1388);
      auVar23._4_4_ = fStack_139c;
      auVar23._0_4_ = local_13a0;
      auVar23._8_4_ = fStack_1398;
      auVar23._12_4_ = fStack_1394;
      auVar23._16_4_ = fStack_1390;
      auVar23._20_4_ = fStack_138c;
      auVar23._24_4_ = fStack_1388;
      auVar23._28_4_ = uStack_f68._4_4_;
      local_1400._0_8_ = auVar3._0_8_;
      local_dc0 = local_1400._0_8_;
      local_1400._8_8_ = auVar3._8_8_;
      uStack_db8 = local_1400._8_8_;
      uStack_db0 = 0;
      uStack_da8 = 0;
      local_de0 = local_820._0_8_;
      uStack_dd8 = local_820._8_8_;
      uStack_dd0 = auStack_810._0_8_;
      uStack_dc8 = auStack_810._8_8_;
      auVar28._16_8_ = auStack_810._0_8_;
      auVar28._0_16_ = local_820;
      auVar28._24_8_ = auStack_810._8_8_;
      auVar5 = vfmadd213ps_fma(ZEXT1632(auVar3),auVar23,auVar28);
      local_e98 = &local_11c0;
      local_ea0 = &local_1200;
      local_d40 = CONCAT44(fStack_139c,local_13a0);
      uStack_d38 = CONCAT44(fStack_1394,fStack_1398);
      uStack_d30 = CONCAT44(fStack_138c,fStack_1390);
      uStack_d28 = CONCAT44(uStack_f68._4_4_,fStack_1388);
      auVar24._4_4_ = fStack_139c;
      auVar24._0_4_ = local_13a0;
      auVar24._8_4_ = fStack_1398;
      auVar24._12_4_ = fStack_1394;
      auVar24._16_4_ = fStack_1390;
      auVar24._20_4_ = fStack_138c;
      auVar24._24_4_ = fStack_1388;
      auVar24._28_4_ = uStack_f68._4_4_;
      local_d60 = local_960._0_8_;
      uStack_d58 = local_960._8_8_;
      uStack_d50 = auStack_950._0_8_;
      uStack_d48 = auStack_950._8_8_;
      auVar33._16_8_ = auStack_950._0_8_;
      auVar33._0_16_ = local_960;
      auVar33._24_8_ = auStack_950._8_8_;
      local_d80 = local_8e0._0_8_;
      uStack_d78 = local_8e0._8_8_;
      uStack_d70 = auStack_8d0._0_8_;
      uStack_d68 = auStack_8d0._8_8_;
      auVar31._16_8_ = auStack_8d0._0_8_;
      auVar31._0_16_ = local_8e0;
      auVar31._24_8_ = auStack_8d0._8_8_;
      auVar6 = vfmadd213ps_fma(auVar33,auVar24,auVar31);
      local_eb0 = local_1440;
      local_eb8 = &local_1240;
      local_ce0 = CONCAT44(fStack_139c,local_13a0);
      uStack_cd8 = CONCAT44(fStack_1394,fStack_1398);
      uStack_cd0 = CONCAT44(fStack_138c,fStack_1390);
      uStack_cc8 = CONCAT44(uStack_f68._4_4_,fStack_1388);
      auVar25._4_4_ = fStack_139c;
      auVar25._0_4_ = local_13a0;
      auVar25._8_4_ = fStack_1398;
      auVar25._12_4_ = fStack_1394;
      auVar25._16_4_ = fStack_1390;
      auVar25._20_4_ = fStack_138c;
      auVar25._24_4_ = fStack_1388;
      auVar25._28_4_ = uStack_f68._4_4_;
      local_1440._0_8_ = auVar6._0_8_;
      local_d00 = local_1440._0_8_;
      local_1440._8_8_ = auVar6._8_8_;
      uStack_cf8 = local_1440._8_8_;
      uStack_cf0 = 0;
      uStack_ce8 = 0;
      local_d20 = local_860._0_8_;
      uStack_d18 = local_860._8_8_;
      uStack_d10 = auStack_850._0_8_;
      uStack_d08 = auStack_850._8_8_;
      auVar29._16_8_ = auStack_850._0_8_;
      auVar29._0_16_ = local_860;
      auVar29._24_8_ = auStack_850._8_8_;
      auVar7 = vfmadd213ps_fma(ZEXT1632(auVar6),auVar25,auVar29);
      local_ec0 = &local_1380;
      local_ec8 = local_13e0;
      local_ed0 = local_1420;
      local_c80 = CONCAT44(fStack_137c,local_1380);
      uStack_c78 = CONCAT44(fStack_1374,fStack_1378);
      uStack_c70 = CONCAT44(fStack_136c,fStack_1370);
      uStack_c68 = CONCAT44(uStack_f68._4_4_,fStack_1368);
      auVar26._4_4_ = fStack_137c;
      auVar26._0_4_ = local_1380;
      auVar26._8_4_ = fStack_1378;
      auVar26._12_4_ = fStack_1374;
      auVar26._16_4_ = fStack_1370;
      auVar26._20_4_ = fStack_136c;
      auVar26._24_4_ = fStack_1368;
      auVar26._28_4_ = uStack_f68._4_4_;
      local_13e0._0_8_ = auVar5._0_8_;
      local_ca0 = local_13e0._0_8_;
      local_13e0._8_8_ = auVar5._8_8_;
      uStack_c98 = local_13e0._8_8_;
      uStack_c90 = 0;
      uStack_c88 = 0;
      local_1420._0_8_ = auVar7._0_8_;
      local_cc0 = local_1420._0_8_;
      local_1420._8_8_ = auVar7._8_8_;
      uStack_cb8 = local_1420._8_8_;
      uStack_cb0 = 0;
      uStack_ca8 = 0;
      auVar8 = vfmadd213ps_fma(ZEXT1632(auVar5),auVar26,ZEXT1632(auVar7));
      local_13c0._0_8_ = auVar8._0_8_;
      uVar4 = local_13c0._0_8_;
      local_13c0._8_8_ = auVar8._8_8_;
      uVar11 = local_13c0._8_8_;
      uStack_ff0 = 0;
      uStack_fe8 = 0;
      local_1020 = local_1360._0_8_;
      uStack_1018 = local_1360._8_8_;
      uStack_1010 = local_1360._16_8_;
      uStack_1008 = local_1360._24_8_;
      local_1000._0_4_ = auVar8._0_4_;
      local_1000._4_4_ = auVar8._4_4_;
      uStack_ff8._0_4_ = auVar8._8_4_;
      uStack_ff8._4_4_ = auVar8._12_4_;
      uStack_1464 = 0;
      local_1480 = (float)local_1000 * (float)local_f80;
      fStack_147c = local_1000._4_4_ * local_f80._4_4_;
      fStack_1478 = (float)uStack_ff8 * (float)uStack_f78;
      fStack_1474 = uStack_ff8._4_4_ * uStack_f78._4_4_;
      fStack_1470 = (float)uStack_f70 * 0.0;
      fStack_146c = uStack_f70._4_4_ * 0.0;
      fStack_1468 = (float)uStack_f68 * 0.0;
      local_e48 = &local_12a0;
      local_e50 = local_1320;
      local_e58 = &local_11a0;
      local_bc0 = local_7a0._0_8_;
      uStack_bb8 = local_7a0._8_8_;
      uStack_bb0 = auStack_790._0_8_;
      uStack_ba8 = auStack_790._8_8_;
      auVar27._16_8_ = auStack_790._0_8_;
      auVar27._0_16_ = local_7a0;
      auVar27._24_8_ = auStack_790._8_8_;
      local_be0 = local_1320._0_8_;
      uStack_bd8 = local_1320._8_8_;
      uStack_bd0 = local_1320._16_8_;
      uStack_bc8 = local_1320._24_8_;
      local_c00 = local_9a0._0_8_;
      uStack_bf8 = local_9a0._8_8_;
      uStack_bf0 = auStack_990._0_8_;
      uStack_be8 = auStack_990._8_8_;
      auVar34._16_8_ = auStack_990._0_8_;
      auVar34._0_16_ = local_9a0;
      auVar34._24_8_ = auStack_990._8_8_;
      auVar54._8_4_ = 0x80000000;
      auVar54._0_8_ = 0x8000000080000000;
      auVar54._12_4_ = 0x80000000;
      auVar54._16_4_ = 0x80000000;
      auVar54._20_4_ = 0x80000000;
      auVar54._24_4_ = 0x80000000;
      auVar54._28_4_ = 0x80000000;
      auVar9 = vfmadd213ps_fma(local_1320,auVar27 ^ auVar54,auVar34);
      local_1040._0_4_ = local_7e0._0_4_;
      local_1040._4_4_ = local_7e0._4_4_;
      uStack_1038._0_4_ = local_7e0._8_4_;
      uStack_1038._4_4_ = local_7e0._12_4_;
      uStack_1030._0_4_ = auStack_7d0._0_4_;
      uStack_1030._4_4_ = auStack_7d0._4_4_;
      uStack_1028._0_4_ = auStack_7d0._8_4_;
      uStack_1028._4_4_ = auStack_7d0._12_4_;
      uStack_14a4 = uStack_1028._4_4_;
      local_1060._0_4_ = local_1320._0_4_;
      local_1060._4_4_ = local_1320._4_4_;
      uStack_1058._0_4_ = local_1320._8_4_;
      uStack_1058._4_4_ = local_1320._12_4_;
      uStack_1050._0_4_ = local_1320._16_4_;
      uStack_1050._4_4_ = local_1320._20_4_;
      uStack_1048._0_4_ = local_1320._24_4_;
      local_14c0 = (float)local_1040 * (float)local_1060;
      fStack_14bc = local_1040._4_4_ * local_1060._4_4_;
      fStack_14b8 = (float)uStack_1038 * (float)uStack_1058;
      fStack_14b4 = uStack_1038._4_4_ * uStack_1058._4_4_;
      fStack_14b0 = (float)uStack_1030 * (float)uStack_1050;
      fStack_14ac = uStack_1030._4_4_ * uStack_1050._4_4_;
      fStack_14a8 = (float)uStack_1028 * (float)uStack_1048;
      local_ed8 = &local_1480;
      local_ee0 = local_14a0;
      local_ee8 = &local_14c0;
      local_c20 = CONCAT44(fStack_147c,local_1480);
      uStack_c18 = CONCAT44(fStack_1474,fStack_1478);
      uStack_c10 = CONCAT44(fStack_146c,fStack_1470);
      uStack_c08 = (ulong)(uint)fStack_1468;
      auVar21._4_4_ = fStack_147c;
      auVar21._0_4_ = local_1480;
      auVar21._8_4_ = fStack_1478;
      auVar21._12_4_ = fStack_1474;
      auVar21._16_4_ = fStack_1470;
      auVar21._20_4_ = fStack_146c;
      auVar21._24_4_ = fStack_1468;
      auVar21._28_4_ = 0;
      local_14a0._0_8_ = auVar9._0_8_;
      local_c40 = local_14a0._0_8_;
      local_14a0._8_8_ = auVar9._8_8_;
      uStack_c38 = local_14a0._8_8_;
      uStack_c30 = 0;
      uStack_c28 = 0;
      local_c60 = CONCAT44(fStack_14bc,local_14c0);
      uStack_c58 = CONCAT44(fStack_14b4,fStack_14b8);
      uStack_c50 = CONCAT44(fStack_14ac,fStack_14b0);
      uStack_c48 = CONCAT44(uStack_1028._4_4_,fStack_14a8);
      auVar20._4_4_ = fStack_14bc;
      auVar20._0_4_ = local_14c0;
      auVar20._8_4_ = fStack_14b8;
      auVar20._12_4_ = fStack_14b4;
      auVar20._16_4_ = fStack_14b0;
      auVar20._20_4_ = fStack_14ac;
      auVar20._24_4_ = fStack_14a8;
      auVar20._28_4_ = uStack_1028._4_4_;
      auVar10 = vfmadd213ps_fma(ZEXT1632(auVar9),auVar21,auVar20);
      local_1460._0_8_ = auVar10._0_8_;
      local_b80 = local_1460._0_8_;
      local_1460._8_8_ = auVar10._8_8_;
      uStack_b78 = local_1460._8_8_;
      uStack_b70 = 0;
      uStack_b68 = 0;
      local_ba0 = local_12c0._0_8_;
      uStack_b98 = local_12c0._8_8_;
      uStack_b90 = local_12c0._16_8_;
      uStack_b88 = local_12c0._24_8_;
      local_2de0 = vpor_avx2(ZEXT1632(auVar10),local_12c0);
      local_2c20 = local_2d30;
      local_2c40 = local_2de0._0_8_;
      uStack_2c38 = local_2de0._8_8_;
      uStack_2c30 = local_2de0._16_8_;
      uStack_2c28 = local_2de0._24_8_;
      *(undefined1 (*) [32])*local_2d30 = local_2de0;
      local_2d30 = (undefined1 (*) [64])(*local_2d30 + 0x20);
      local_14a0 = ZEXT1632(auVar9);
      local_1460 = ZEXT1632(auVar10);
      local_1440 = ZEXT1632(auVar6);
      local_1420 = ZEXT1632(auVar7);
      local_1400 = ZEXT1632(auVar3);
      local_13e0 = ZEXT1632(auVar5);
      local_13c0 = ZEXT1632(auVar8);
      local_10e0 = local_1140;
      uStack_10d8 = uStack_1138;
      uStack_10d0 = uStack_1130;
      uStack_10c8 = uStack_1128;
      local_1060 = local_1320._0_8_;
      uStack_1058 = local_1320._8_8_;
      uStack_1050 = local_1320._16_8_;
      uStack_1048 = local_1320._24_8_;
      local_1040 = local_7e0._0_8_;
      uStack_1038 = local_7e0._8_8_;
      uStack_1030 = auStack_7d0._0_8_;
      uStack_1028 = auStack_7d0._8_8_;
      local_1000 = uVar4;
      uStack_ff8 = uVar11;
      local_fc0 = local_fe0;
      uStack_fb8 = uStack_fd8;
      uStack_fb0 = uStack_fd0;
      uStack_fa8 = uStack_fc8;
      local_f80 = local_fa0;
      uStack_f78 = uStack_f98;
      uStack_f70 = uStack_f90;
      uStack_f68 = uStack_f88;
      local_f40 = local_9e0._0_8_;
      uStack_f38 = local_9e0._8_8_;
      uStack_f30 = auStack_9d0._0_8_;
      uStack_f28 = auStack_9d0._8_8_;
      local_e90 = local_ea8;
      local_e78 = local_ea8;
      local_e60 = local_ea8;
      local_aa0 = local_1140;
      uStack_a98 = uStack_1138;
      uStack_a90 = uStack_1130;
      uStack_a88 = uStack_1128;
      local_9fc = local_a00;
      local_9f8 = local_a00;
      local_9f4 = local_a00;
      local_9f0 = local_a00;
      local_9ec = local_a00;
      local_9e8 = local_a00;
      local_9e4 = local_a00;
      local_9bc = local_9c0;
      local_9b8 = local_9c0;
      local_9b4 = local_9c0;
      local_9b0 = local_9c0;
      local_9ac = local_9c0;
      local_9a8 = local_9c0;
      local_9a4 = local_9c0;
      local_97c = local_980;
      local_978 = local_980;
      local_974 = local_980;
      local_970 = local_980;
      local_96c = local_980;
      local_968 = local_980;
      local_964 = local_980;
      local_93c = local_940;
      local_938 = local_940;
      local_934 = local_940;
      local_930 = local_940;
      local_92c = local_940;
      local_928 = local_940;
      local_924 = local_940;
      local_8fc = local_900;
      local_8f8 = local_900;
      local_8f4 = local_900;
      local_8f0 = local_900;
      local_8ec = local_900;
      local_8e8 = local_900;
      local_8e4 = local_900;
      local_8bc = local_8c0;
      local_8b8 = local_8c0;
      local_8b4 = local_8c0;
      local_8b0 = local_8c0;
      local_8ac = local_8c0;
      local_8a8 = local_8c0;
      local_8a4 = local_8c0;
      local_87c = local_880;
      local_878 = local_880;
      local_874 = local_880;
      local_870 = local_880;
      local_86c = local_880;
      local_868 = local_880;
      local_864 = local_880;
      local_83c = local_840;
      local_838 = local_840;
      local_834 = local_840;
      local_830 = local_840;
      local_82c = local_840;
      local_828 = local_840;
      local_824 = local_840;
      local_7fc = local_800;
      local_7f8 = local_800;
      local_7f4 = local_800;
      local_7f0 = local_800;
      local_7ec = local_800;
      local_7e8 = local_800;
      local_7e4 = local_800;
      local_7bc = local_7c0;
      local_7b8 = local_7c0;
      local_7b4 = local_7c0;
      local_7b0 = local_7c0;
      local_7ac = local_7c0;
      local_7a8 = local_7c0;
      local_7a4 = local_7c0;
      local_77c = local_780;
      local_778 = local_780;
      local_774 = local_780;
      local_770 = local_780;
      local_76c = local_780;
      local_768 = local_780;
      local_764 = local_780;
    }
    for (; local_2ba8 = local_2cd0, local_2d58 = local_2bf8, local_2d7c + 3 < local_2d24;
        local_2d7c = local_2d7c + 4) {
      local_2c18 = local_2d30;
      auVar5 = *(undefined1 (*) [16])*local_2d30;
      local_2b58 = local_2d09;
      local_2b60 = local_2df0;
      local_2df0._0_8_ = auVar5._0_8_;
      local_5a0 = local_2df0._0_8_;
      local_2df0._8_8_ = auVar5._8_8_;
      uStack_598 = local_2df0._8_8_;
      local_74 = 0x80000000;
      local_54 = 0x80000000;
      local_70 = 0x80000000;
      local_5b0 = 0x8000000080000000;
      uStack_5a8 = 0x8000000080000000;
      local_94 = 0x3f000000;
      local_78 = 0x3f000000;
      local_90 = 0x3f000000;
      local_5c0 = 0x3f0000003f000000;
      uStack_5b8 = 0x3f0000003f000000;
      local_b4 = 0x3f800000;
      local_98 = 0x3f800000;
      local_b0 = 0x3f800000;
      local_5d0 = 0x3f8000003f800000;
      uStack_5c8 = 0x3f8000003f800000;
      local_d4 = 0x3cc48f19;
      local_b8 = 0x3cc48f19;
      local_d0 = 0x3cc48f19;
      local_5e0 = 0x3cc48f193cc48f19;
      uStack_5d8 = 0x3cc48f193cc48f19;
      local_f4 = 0x3d2dbdcf;
      local_d8 = 0x3d2dbdcf;
      local_f0 = 0x3d2dbdcf;
      local_5f0 = 0x3d2dbdcf3d2dbdcf;
      uStack_5e8 = 0x3d2dbdcf3d2dbdcf;
      local_114 = 0x3d997dcc;
      local_f8 = 0x3d997dcc;
      local_110 = 0x3d997dcc;
      local_600 = 0x3d997dcc3d997dcc;
      uStack_5f8 = 0x3d997dcc3d997dcc;
      local_134 = 0x3d3a73d8;
      local_118 = 0x3d3a73d8;
      local_130 = 0x3d3a73d8;
      local_610 = 0x3d3a73d83d3a73d8;
      uStack_608 = 0x3d3a73d83d3a73d8;
      local_154 = 0x3f800000;
      local_138 = 0x3f800000;
      local_150 = 0x3f800000;
      local_620 = 0x3f8000003f800000;
      uStack_618 = 0x3f8000003f800000;
      local_174 = 0x3e2aaaf8;
      local_158 = 0x3e2aaaf8;
      local_170 = 0x3e2aaaf8;
      local_630 = 0x3e2aaaf83e2aaaf8;
      uStack_628 = 0x3e2aaaf83e2aaaf8;
      local_194 = 0x3fc90fdb;
      local_178 = 0x3fc90fdb;
      local_190 = 0x3fc90fdb;
      local_640 = 0x3fc90fdb3fc90fdb;
      uStack_638 = 0x3fc90fdb3fc90fdb;
      local_1b4 = 0x40400000;
      local_198 = 0x40400000;
      local_1b0 = 0x40400000;
      local_650 = 0x4040000040400000;
      uStack_648 = 0x4040000040400000;
      auVar3._8_8_ = 0x8000000080000000;
      auVar3._0_8_ = 0x8000000080000000;
      local_660 = vpand_avx(auVar3,auVar5);
      auVar9._8_8_ = 0x8000000080000000;
      auVar9._0_8_ = 0x8000000080000000;
      local_670 = vpandn_avx(auVar9,auVar5);
      local_270 = local_670._0_8_;
      uStack_268 = local_670._8_8_;
      auVar7._8_8_ = 0x3f0000003f000000;
      auVar7._0_8_ = 0x3f0000003f000000;
      local_680 = vcmpps_avx(local_670,auVar7,2);
      local_1f0 = local_680._0_8_;
      uStack_1e8 = local_680._8_8_;
      auVar8._8_8_ = 0x3f8000003f800000;
      auVar8._0_8_ = 0x3f8000003f800000;
      local_690 = vpandn_avx(local_680,auVar8);
      local_550 = local_670._0_8_;
      uStack_548 = local_670._8_8_;
      auVar5._8_8_ = 0x3f8000003f800000;
      auVar5._0_8_ = 0x3f8000003f800000;
      _local_4b0 = vsubps_avx(auVar5,local_670);
      local_490 = (float)local_4b0._0_4_ * 0.5;
      fStack_48c = (float)local_4b0._4_4_ * 0.5;
      fStack_488 = fStack_4a8 * 0.5;
      fStack_484 = fStack_4a4 * 0.5;
      auVar6._4_4_ = fStack_48c;
      auVar6._0_4_ = local_490;
      auVar6._8_4_ = fStack_488;
      auVar6._12_4_ = fStack_484;
      local_6a0 = vsqrtps_avx(auVar6);
      local_580 = local_680._0_8_;
      uStack_578 = local_680._8_8_;
      local_590 = local_670._0_8_;
      uStack_588 = local_670._8_8_;
      local_230 = vpand_avx(local_680,local_670);
      local_210 = local_680._0_8_;
      uStack_208 = local_680._8_8_;
      local_220 = local_6a0._0_8_;
      uStack_218 = local_6a0._8_8_;
      local_240 = vpandn_avx(local_680,local_6a0);
      local_6b0 = vpor_avx(local_230,local_240);
      local_4d0 = local_6b0._0_8_;
      uStack_4c8 = local_6b0._8_8_;
      local_4c0._0_4_ = local_6b0._0_4_;
      local_4c0._4_4_ = local_6b0._4_4_;
      uStack_4b8._0_4_ = local_6b0._8_4_;
      uStack_4b8._4_4_ = local_6b0._12_4_;
      local_6c0 = (float)local_4c0 * (float)local_4c0;
      fStack_6bc = local_4c0._4_4_ * local_4c0._4_4_;
      fStack_6b8 = (float)uStack_4b8 * (float)uStack_4b8;
      fStack_6b4 = uStack_4b8._4_4_ * uStack_4b8._4_4_;
      local_4f0 = CONCAT44(fStack_6bc,local_6c0);
      uStack_4e8 = CONCAT44(fStack_6b4,fStack_6b8);
      local_6d0 = local_6c0 * local_6c0;
      fStack_6cc = fStack_6bc * fStack_6bc;
      fStack_6c8 = fStack_6b8 * fStack_6b8;
      fStack_6c4 = fStack_6b4 * fStack_6b4;
      local_420 = &local_6d0;
      local_3e0 = &local_5f0;
      local_3e8 = &local_610;
      local_380 = CONCAT44(fStack_6cc,local_6d0);
      uStack_378 = CONCAT44(fStack_6c4,fStack_6c8);
      auVar36._4_4_ = fStack_6cc;
      auVar36._0_4_ = local_6d0;
      auVar36._8_4_ = fStack_6c8;
      auVar36._12_4_ = fStack_6c4;
      local_390 = 0x3d2dbdcf3d2dbdcf;
      uStack_388 = 0x3d2dbdcf3d2dbdcf;
      auVar46._8_8_ = 0x3d2dbdcf3d2dbdcf;
      auVar46._0_8_ = 0x3d2dbdcf3d2dbdcf;
      local_3a0 = 0x3d3a73d83d3a73d8;
      uStack_398 = 0x3d3a73d83d3a73d8;
      auVar44._8_8_ = 0x3d3a73d83d3a73d8;
      auVar44._0_8_ = 0x3d3a73d83d3a73d8;
      local_700 = vfmadd213ps_fma(auVar46,auVar36,auVar44);
      local_3f8 = local_700;
      local_400 = &local_630;
      local_350 = CONCAT44(fStack_6cc,local_6d0);
      uStack_348 = CONCAT44(fStack_6c4,fStack_6c8);
      auVar37._4_4_ = fStack_6cc;
      auVar37._0_4_ = local_6d0;
      auVar37._8_4_ = fStack_6c8;
      auVar37._12_4_ = fStack_6c4;
      local_360 = local_700._0_8_;
      uStack_358 = local_700._8_8_;
      local_370 = 0x3e2aaaf83e2aaaf8;
      uStack_368 = 0x3e2aaaf83e2aaaf8;
      auVar42._8_8_ = 0x3e2aaaf83e2aaaf8;
      auVar42._0_8_ = 0x3e2aaaf83e2aaaf8;
      local_6f0 = vfmadd213ps_fma(local_700,auVar37,auVar42);
      local_410 = &local_5e0;
      local_418 = &local_600;
      local_320 = CONCAT44(fStack_6cc,local_6d0);
      uStack_318 = CONCAT44(fStack_6c4,fStack_6c8);
      auVar38._4_4_ = fStack_6cc;
      auVar38._0_4_ = local_6d0;
      auVar38._8_4_ = fStack_6c8;
      auVar38._12_4_ = fStack_6c4;
      local_330 = 0x3cc48f193cc48f19;
      uStack_328 = 0x3cc48f193cc48f19;
      auVar47._8_8_ = 0x3cc48f193cc48f19;
      auVar47._0_8_ = 0x3cc48f193cc48f19;
      local_340 = 0x3d997dcc3d997dcc;
      uStack_338 = 0x3d997dcc3d997dcc;
      auVar45._8_8_ = 0x3d997dcc3d997dcc;
      auVar45._0_8_ = 0x3d997dcc3d997dcc;
      local_720 = vfmadd213ps_fma(auVar47,auVar38,auVar45);
      local_428 = local_720;
      local_430 = &local_620;
      local_2f0 = CONCAT44(fStack_6cc,local_6d0);
      uStack_2e8 = CONCAT44(fStack_6c4,fStack_6c8);
      auVar39._4_4_ = fStack_6cc;
      auVar39._0_4_ = local_6d0;
      auVar39._8_4_ = fStack_6c8;
      auVar39._12_4_ = fStack_6c4;
      local_300 = local_720._0_8_;
      uStack_2f8 = local_720._8_8_;
      local_310 = 0x3f8000003f800000;
      uStack_308 = 0x3f8000003f800000;
      auVar43._8_8_ = 0x3f8000003f800000;
      auVar43._0_8_ = 0x3f8000003f800000;
      local_710 = vfmadd213ps_fma(local_720,auVar39,auVar43);
      local_438 = &local_6c0;
      local_440 = local_6f0;
      local_448 = local_710;
      local_2c0 = CONCAT44(fStack_6bc,local_6c0);
      uStack_2b8 = CONCAT44(fStack_6b4,fStack_6b8);
      auVar40._4_4_ = fStack_6bc;
      auVar40._0_4_ = local_6c0;
      auVar40._8_4_ = fStack_6b8;
      auVar40._12_4_ = fStack_6b4;
      local_2d0 = local_6f0._0_8_;
      uStack_2c8 = local_6f0._8_8_;
      local_2e0 = local_710._0_8_;
      uStack_2d8 = local_710._8_8_;
      local_6e0 = vfmadd213ps_fma(local_6f0,auVar40,local_710);
      local_510 = local_6b0._0_8_;
      uStack_508 = local_6b0._8_8_;
      local_500._0_4_ = local_6e0._0_4_;
      local_500._4_4_ = local_6e0._4_4_;
      uStack_4f8._0_4_ = local_6e0._8_4_;
      uStack_4f8._4_4_ = local_6e0._12_4_;
      local_740 = (float)local_500 * (float)local_4c0;
      fStack_73c = local_500._4_4_ * local_4c0._4_4_;
      fStack_738 = (float)uStack_4f8 * (float)uStack_4b8;
      fStack_734 = uStack_4f8._4_4_ * uStack_4b8._4_4_;
      local_468 = &local_650;
      local_470 = local_690;
      local_478 = &local_5d0;
      local_3b0 = 0x4040000040400000;
      uStack_3a8 = 0x4040000040400000;
      auVar41._8_8_ = 0x4040000040400000;
      auVar41._0_8_ = 0x4040000040400000;
      local_3c0 = local_690._0_8_;
      uStack_3b8 = local_690._8_8_;
      local_3d0 = 0x3f8000003f800000;
      uStack_3c8 = 0x3f8000003f800000;
      auVar48._8_8_ = 0x3f8000003f800000;
      auVar48._0_8_ = 0x3f8000003f800000;
      auVar53._8_4_ = 0x80000000;
      auVar53._0_8_ = 0x8000000080000000;
      auVar53._12_4_ = 0x80000000;
      local_750 = vfmadd213ps_fma(local_690,auVar41 ^ auVar53,auVar48);
      local_530._0_4_ = local_690._0_4_;
      local_530._4_4_ = local_690._4_4_;
      uStack_528._0_4_ = local_690._8_4_;
      uStack_528._4_4_ = local_690._12_4_;
      local_760 = (float)local_530 * 1.5707964;
      fStack_75c = local_530._4_4_ * 1.5707964;
      fStack_758 = (float)uStack_528 * 1.5707964;
      fStack_754 = uStack_528._4_4_ * 1.5707964;
      local_450 = &local_740;
      local_458 = local_750;
      local_460 = &local_760;
      local_290 = CONCAT44(fStack_73c,local_740);
      uStack_288 = CONCAT44(fStack_734,fStack_738);
      auVar35._4_4_ = fStack_73c;
      auVar35._0_4_ = local_740;
      auVar35._8_4_ = fStack_738;
      auVar35._12_4_ = fStack_734;
      local_2a0 = local_750._0_8_;
      uStack_298 = local_750._8_8_;
      local_2b0 = CONCAT44(fStack_75c,local_760);
      uStack_2a8 = CONCAT44(fStack_754,fStack_758);
      auVar10._4_4_ = fStack_75c;
      auVar10._0_4_ = local_760;
      auVar10._8_4_ = fStack_758;
      auVar10._12_4_ = fStack_754;
      local_730 = vfmadd213ps_fma(local_750,auVar35,auVar10);
      local_250 = local_730._0_8_;
      uStack_248 = local_730._8_8_;
      local_260 = local_660._0_8_;
      uStack_258 = local_660._8_8_;
      local_2df0 = vpor_avx(local_730,local_660);
      local_2c00 = local_2d30;
      local_2c10 = local_2df0._0_8_;
      uStack_2c08 = local_2df0._8_8_;
      *(undefined1 (*) [16])*local_2d30 = local_2df0;
      local_2d30 = (undefined1 (*) [64])(*local_2d30 + 0x10);
      local_570 = local_5a0;
      uStack_568 = uStack_598;
      local_560 = local_5b0;
      uStack_558 = uStack_5a8;
      local_540 = local_5d0;
      uStack_538 = uStack_5c8;
      local_530 = local_690._0_8_;
      uStack_528 = local_690._8_8_;
      local_520 = local_640;
      uStack_518 = uStack_638;
      local_500 = local_6e0._0_8_;
      uStack_4f8 = local_6e0._8_8_;
      local_4e0 = local_4f0;
      uStack_4d8 = uStack_4e8;
      local_4c0 = local_4d0;
      uStack_4b8 = uStack_4c8;
      local_4a0 = local_5c0;
      uStack_498 = uStack_5b8;
      local_408 = local_420;
      local_3f0 = local_420;
      local_3d8 = local_420;
      local_280 = local_5c0;
      uStack_278 = uStack_5b8;
      local_200 = local_5d0;
      uStack_1f8 = uStack_5c8;
      local_1e0 = local_5a0;
      uStack_1d8 = uStack_598;
      local_1d0 = local_5b0;
      uStack_1c8 = uStack_5a8;
      uStack_1ac = local_1b0;
      uStack_1a8 = local_1b0;
      uStack_1a4 = local_1b0;
      uStack_18c = local_190;
      uStack_188 = local_190;
      uStack_184 = local_190;
      uStack_16c = local_170;
      uStack_168 = local_170;
      uStack_164 = local_170;
      uStack_14c = local_150;
      uStack_148 = local_150;
      uStack_144 = local_150;
      uStack_12c = local_130;
      uStack_128 = local_130;
      uStack_124 = local_130;
      uStack_10c = local_110;
      uStack_108 = local_110;
      uStack_104 = local_110;
      uStack_ec = local_f0;
      uStack_e8 = local_f0;
      uStack_e4 = local_f0;
      uStack_cc = local_d0;
      uStack_c8 = local_d0;
      uStack_c4 = local_d0;
      uStack_ac = local_b0;
      uStack_a8 = local_b0;
      uStack_a4 = local_b0;
      uStack_8c = local_90;
      uStack_88 = local_90;
      uStack_84 = local_90;
      uStack_6c = local_70;
      uStack_68 = local_70;
      uStack_64 = local_70;
    }
    for (; local_2d7c < local_2d24; local_2d7c = local_2d7c + 1) {
      local_2b48 = local_2d09;
      local_2b50 = local_2d30;
      fVar52 = asinf(*(float *)*local_2d30);
      *(float *)*local_2d30 = fVar52;
      local_2d30 = (undefined1 (*) [64])(*local_2d30 + 4);
    }
  }
  return 0;
}

Assistant:

static int unary_op_inplace(Mat& a, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = a.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = op.func_pack16(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = op.func_pack8(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = op.func_pack4(_p);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = op.func(*ptr);
            ptr++;
        }
    }

    return 0;
}